

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  uint uVar13;
  int iVar14;
  undefined4 uVar15;
  __int_type_conflict _Var16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined8 uVar25;
  long lVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  int iVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  Geometry *pGVar70;
  byte bVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar74;
  long lVar75;
  long lVar76;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  Geometry *pGVar77;
  uint uVar78;
  ulong uVar79;
  byte bVar80;
  ulong uVar81;
  ulong uVar82;
  float fVar83;
  float fVar84;
  float fVar133;
  float fVar134;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar90 [16];
  float fVar135;
  float fVar137;
  float fVar138;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar91 [16];
  float fVar136;
  float fVar139;
  float fVar140;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar141;
  float fVar142;
  undefined4 uVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar157;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar159 [16];
  undefined8 uVar158;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar164 [16];
  float fVar162;
  float fVar163;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar172;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar209 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5f0 [16];
  Precalculations *local_5d8;
  undefined1 local_5d0 [8];
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  RTCFilterFunctionNArguments local_588;
  Geometry *local_558;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  LinearSpace3fa *local_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  int local_470;
  int iStack_46c;
  int iStack_468;
  int iStack_464;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 local_410 [16];
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar210 [32];
  
  PVar12 = prim[1];
  uVar72 = (ulong)(byte)PVar12;
  lVar26 = uVar72 * 0x25;
  fVar163 = *(float *)(prim + lVar26 + 0x12);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar88 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar89 = vsubps_avx(auVar86,*(undefined1 (*) [16])(prim + lVar26 + 6));
  fVar173 = fVar163 * auVar89._0_4_;
  fVar141 = fVar163 * auVar88._0_4_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar72 * 4 + 6);
  auVar99 = vpmovsxbd_avx2(auVar86);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar72 * 5 + 6);
  auVar98 = vpmovsxbd_avx2(auVar85);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar72 * 6 + 6);
  auVar107 = vpmovsxbd_avx2(auVar87);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar72 * 0xf + 6);
  auVar106 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar96 = vpmovsxbd_avx2(auVar7);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar100 = vcvtdq2ps_avx(auVar96);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar72 + 6);
  auVar101 = vpmovsxbd_avx2(auVar8);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar72 * 0x1a + 6);
  auVar105 = vpmovsxbd_avx2(auVar9);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar72 * 0x1b + 6);
  auVar102 = vpmovsxbd_avx2(auVar10);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar72 * 0x1c + 6);
  auVar97 = vpmovsxbd_avx2(auVar11);
  auVar103 = vcvtdq2ps_avx(auVar97);
  auVar191._4_4_ = fVar141;
  auVar191._0_4_ = fVar141;
  auVar191._8_4_ = fVar141;
  auVar191._12_4_ = fVar141;
  auVar191._16_4_ = fVar141;
  auVar191._20_4_ = fVar141;
  auVar191._24_4_ = fVar141;
  auVar191._28_4_ = fVar141;
  auVar92 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar216 = ZEXT3264(auVar92);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar214 = ZEXT3264(auVar93);
  auVar104 = ZEXT1632(CONCAT412(fVar163 * auVar88._12_4_,
                                CONCAT48(fVar163 * auVar88._8_4_,
                                         CONCAT44(fVar163 * auVar88._4_4_,fVar141))));
  auVar94 = vpermps_avx512vl(auVar92,auVar104);
  auVar95 = vpermps_avx512vl(auVar93,auVar104);
  fVar142 = auVar95._0_4_;
  fVar157 = auVar95._4_4_;
  auVar104._4_4_ = fVar157 * auVar107._4_4_;
  auVar104._0_4_ = fVar142 * auVar107._0_4_;
  fVar162 = auVar95._8_4_;
  auVar104._8_4_ = fVar162 * auVar107._8_4_;
  fVar172 = auVar95._12_4_;
  auVar104._12_4_ = fVar172 * auVar107._12_4_;
  fVar83 = auVar95._16_4_;
  auVar104._16_4_ = fVar83 * auVar107._16_4_;
  fVar84 = auVar95._20_4_;
  auVar104._20_4_ = fVar84 * auVar107._20_4_;
  fVar133 = auVar95._24_4_;
  auVar104._24_4_ = fVar133 * auVar107._24_4_;
  auVar104._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar101._4_4_ * fVar157;
  auVar96._0_4_ = auVar101._0_4_ * fVar142;
  auVar96._8_4_ = auVar101._8_4_ * fVar162;
  auVar96._12_4_ = auVar101._12_4_ * fVar172;
  auVar96._16_4_ = auVar101._16_4_ * fVar83;
  auVar96._20_4_ = auVar101._20_4_ * fVar84;
  auVar96._24_4_ = auVar101._24_4_ * fVar133;
  auVar96._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar103._4_4_ * fVar157;
  auVar97._0_4_ = auVar103._0_4_ * fVar142;
  auVar97._8_4_ = auVar103._8_4_ * fVar162;
  auVar97._12_4_ = auVar103._12_4_ * fVar172;
  auVar97._16_4_ = auVar103._16_4_ * fVar83;
  auVar97._20_4_ = auVar103._20_4_ * fVar84;
  auVar97._24_4_ = auVar103._24_4_ * fVar133;
  auVar97._28_4_ = auVar95._28_4_;
  auVar86 = vfmadd231ps_fma(auVar104,auVar94,auVar98);
  auVar85 = vfmadd231ps_fma(auVar96,auVar94,auVar100);
  auVar87 = vfmadd231ps_fma(auVar97,auVar102,auVar94);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar191,auVar99);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar191,auVar106);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar105,auVar191);
  auVar207._4_4_ = fVar173;
  auVar207._0_4_ = fVar173;
  auVar207._8_4_ = fVar173;
  auVar207._12_4_ = fVar173;
  auVar207._16_4_ = fVar173;
  auVar207._20_4_ = fVar173;
  auVar207._24_4_ = fVar173;
  auVar207._28_4_ = fVar173;
  auVar97 = ZEXT1632(CONCAT412(fVar163 * auVar89._12_4_,
                               CONCAT48(fVar163 * auVar89._8_4_,
                                        CONCAT44(fVar163 * auVar89._4_4_,fVar173))));
  auVar96 = vpermps_avx512vl(auVar92,auVar97);
  auVar97 = vpermps_avx512vl(auVar93,auVar97);
  fVar163 = auVar97._0_4_;
  fVar142 = auVar97._4_4_;
  auVar92._4_4_ = fVar142 * auVar107._4_4_;
  auVar92._0_4_ = fVar163 * auVar107._0_4_;
  fVar157 = auVar97._8_4_;
  auVar92._8_4_ = fVar157 * auVar107._8_4_;
  fVar162 = auVar97._12_4_;
  auVar92._12_4_ = fVar162 * auVar107._12_4_;
  fVar172 = auVar97._16_4_;
  auVar92._16_4_ = fVar172 * auVar107._16_4_;
  fVar83 = auVar97._20_4_;
  auVar92._20_4_ = fVar83 * auVar107._20_4_;
  fVar84 = auVar97._24_4_;
  auVar92._24_4_ = fVar84 * auVar107._24_4_;
  auVar92._28_4_ = fVar141;
  auVar93._4_4_ = auVar101._4_4_ * fVar142;
  auVar93._0_4_ = auVar101._0_4_ * fVar163;
  auVar93._8_4_ = auVar101._8_4_ * fVar157;
  auVar93._12_4_ = auVar101._12_4_ * fVar162;
  auVar93._16_4_ = auVar101._16_4_ * fVar172;
  auVar93._20_4_ = auVar101._20_4_ * fVar83;
  auVar93._24_4_ = auVar101._24_4_ * fVar84;
  auVar93._28_4_ = auVar107._28_4_;
  auVar101._4_4_ = auVar103._4_4_ * fVar142;
  auVar101._0_4_ = auVar103._0_4_ * fVar163;
  auVar101._8_4_ = auVar103._8_4_ * fVar157;
  auVar101._12_4_ = auVar103._12_4_ * fVar162;
  auVar101._16_4_ = auVar103._16_4_ * fVar172;
  auVar101._20_4_ = auVar103._20_4_ * fVar83;
  auVar101._24_4_ = auVar103._24_4_ * fVar84;
  auVar101._28_4_ = auVar97._28_4_;
  auVar6 = vfmadd231ps_fma(auVar92,auVar96,auVar98);
  auVar7 = vfmadd231ps_fma(auVar93,auVar96,auVar100);
  auVar8 = vfmadd231ps_fma(auVar101,auVar96,auVar102);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar207,auVar99);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar207,auVar106);
  auVar199._8_4_ = 0x7fffffff;
  auVar199._0_8_ = 0x7fffffff7fffffff;
  auVar199._12_4_ = 0x7fffffff;
  auVar199._16_4_ = 0x7fffffff;
  auVar199._20_4_ = 0x7fffffff;
  auVar199._24_4_ = 0x7fffffff;
  auVar199._28_4_ = 0x7fffffff;
  auVar159 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar207,auVar105);
  auVar99 = vandps_avx(auVar199,ZEXT1632(auVar86));
  auVar194._8_4_ = 0x219392ef;
  auVar194._0_8_ = 0x219392ef219392ef;
  auVar194._12_4_ = 0x219392ef;
  auVar194._16_4_ = 0x219392ef;
  auVar194._20_4_ = 0x219392ef;
  auVar194._24_4_ = 0x219392ef;
  auVar194._28_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar99,auVar194,1);
  bVar19 = (bool)((byte)uVar79 & 1);
  auVar94._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar86._0_4_;
  bVar19 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar86._4_4_;
  bVar19 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar86._8_4_;
  bVar19 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar86._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(auVar199,ZEXT1632(auVar85));
  uVar79 = vcmpps_avx512vl(auVar99,auVar194,1);
  bVar19 = (bool)((byte)uVar79 & 1);
  auVar95._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar85._0_4_;
  bVar19 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar85._4_4_;
  bVar19 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar85._8_4_;
  bVar19 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar85._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(auVar199,ZEXT1632(auVar87));
  uVar79 = vcmpps_avx512vl(auVar99,auVar194,1);
  bVar19 = (bool)((byte)uVar79 & 1);
  auVar99._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar87._0_4_;
  bVar19 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar87._4_4_;
  bVar19 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar87._8_4_;
  bVar19 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar87._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar98 = vrcp14ps_avx512vl(auVar94);
  auVar195._8_4_ = 0x3f800000;
  auVar195._0_8_ = 0x3f8000003f800000;
  auVar195._12_4_ = 0x3f800000;
  auVar195._16_4_ = 0x3f800000;
  auVar195._20_4_ = 0x3f800000;
  auVar195._24_4_ = 0x3f800000;
  auVar195._28_4_ = 0x3f800000;
  auVar86 = vfnmadd213ps_fma(auVar94,auVar98,auVar195);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar95);
  auVar85 = vfnmadd213ps_fma(auVar95,auVar98,auVar195);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar99);
  auVar87 = vfnmadd213ps_fma(auVar99,auVar98,auVar195);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar98,auVar98);
  fVar163 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar26 + 0x16)) *
            *(float *)(prim + lVar26 + 0x1a);
  auVar193._4_4_ = fVar163;
  auVar193._0_4_ = fVar163;
  auVar193._8_4_ = fVar163;
  auVar193._12_4_ = fVar163;
  auVar193._16_4_ = fVar163;
  auVar193._20_4_ = fVar163;
  auVar193._24_4_ = fVar163;
  auVar193._28_4_ = fVar163;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 7 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0xb + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 9 + 6));
  auVar6 = vfmadd213ps_fma(auVar98,auVar193,auVar99);
  auVar99 = vcvtdq2ps_avx(auVar107);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0xd + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar7 = vfmadd213ps_fma(auVar98,auVar193,auVar99);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x12 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  uVar79 = (ulong)(uint)((int)(uVar72 * 5) << 2);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 2 + uVar79 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar8 = vfmadd213ps_fma(auVar98,auVar193,auVar99);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x18 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar9 = vfmadd213ps_fma(auVar98,auVar193,auVar99);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x1d + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 + (ulong)(byte)PVar12 * 0x20 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar10 = vfmadd213ps_fma(auVar98,auVar193,auVar99);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar12 * 0x20 - uVar72) + 6))
  ;
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x23 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar11 = vfmadd213ps_fma(auVar98,auVar193,auVar99);
  auVar99 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar88));
  auVar105._4_4_ = auVar86._4_4_ * auVar99._4_4_;
  auVar105._0_4_ = auVar86._0_4_ * auVar99._0_4_;
  auVar105._8_4_ = auVar86._8_4_ * auVar99._8_4_;
  auVar105._12_4_ = auVar86._12_4_ * auVar99._12_4_;
  auVar105._16_4_ = auVar99._16_4_ * 0.0;
  auVar105._20_4_ = auVar99._20_4_ * 0.0;
  auVar105._24_4_ = auVar99._24_4_ * 0.0;
  auVar105._28_4_ = auVar99._28_4_;
  auVar99 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar88));
  auVar169._0_4_ = auVar86._0_4_ * auVar99._0_4_;
  auVar169._4_4_ = auVar86._4_4_ * auVar99._4_4_;
  auVar169._8_4_ = auVar86._8_4_ * auVar99._8_4_;
  auVar169._12_4_ = auVar86._12_4_ * auVar99._12_4_;
  auVar169._16_4_ = auVar99._16_4_ * 0.0;
  auVar169._20_4_ = auVar99._20_4_ * 0.0;
  auVar169._24_4_ = auVar99._24_4_ * 0.0;
  auVar169._28_4_ = 0;
  auVar99 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar89));
  auVar102._4_4_ = auVar85._4_4_ * auVar99._4_4_;
  auVar102._0_4_ = auVar85._0_4_ * auVar99._0_4_;
  auVar102._8_4_ = auVar85._8_4_ * auVar99._8_4_;
  auVar102._12_4_ = auVar85._12_4_ * auVar99._12_4_;
  auVar102._16_4_ = auVar99._16_4_ * 0.0;
  auVar102._20_4_ = auVar99._20_4_ * 0.0;
  auVar102._24_4_ = auVar99._24_4_ * 0.0;
  auVar102._28_4_ = auVar99._28_4_;
  auVar99 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar89));
  auVar160._0_4_ = auVar85._0_4_ * auVar99._0_4_;
  auVar160._4_4_ = auVar85._4_4_ * auVar99._4_4_;
  auVar160._8_4_ = auVar85._8_4_ * auVar99._8_4_;
  auVar160._12_4_ = auVar85._12_4_ * auVar99._12_4_;
  auVar160._16_4_ = auVar99._16_4_ * 0.0;
  auVar160._20_4_ = auVar99._20_4_ * 0.0;
  auVar160._24_4_ = auVar99._24_4_ * 0.0;
  auVar160._28_4_ = 0;
  auVar99 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar159));
  auVar103._4_4_ = auVar87._4_4_ * auVar99._4_4_;
  auVar103._0_4_ = auVar87._0_4_ * auVar99._0_4_;
  auVar103._8_4_ = auVar87._8_4_ * auVar99._8_4_;
  auVar103._12_4_ = auVar87._12_4_ * auVar99._12_4_;
  auVar103._16_4_ = auVar99._16_4_ * 0.0;
  auVar103._20_4_ = auVar99._20_4_ * 0.0;
  auVar103._24_4_ = auVar99._24_4_ * 0.0;
  auVar103._28_4_ = auVar99._28_4_;
  auVar99 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar159));
  auVar148._0_4_ = auVar87._0_4_ * auVar99._0_4_;
  auVar148._4_4_ = auVar87._4_4_ * auVar99._4_4_;
  auVar148._8_4_ = auVar87._8_4_ * auVar99._8_4_;
  auVar148._12_4_ = auVar87._12_4_ * auVar99._12_4_;
  auVar148._16_4_ = auVar99._16_4_ * 0.0;
  auVar148._20_4_ = auVar99._20_4_ * 0.0;
  auVar148._24_4_ = auVar99._24_4_ * 0.0;
  auVar148._28_4_ = 0;
  auVar99 = vpminsd_avx2(auVar105,auVar169);
  auVar98 = vpminsd_avx2(auVar102,auVar160);
  auVar99 = vmaxps_avx(auVar99,auVar98);
  auVar98 = vpminsd_avx2(auVar103,auVar148);
  uVar143 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar107._4_4_ = uVar143;
  auVar107._0_4_ = uVar143;
  auVar107._8_4_ = uVar143;
  auVar107._12_4_ = uVar143;
  auVar107._16_4_ = uVar143;
  auVar107._20_4_ = uVar143;
  auVar107._24_4_ = uVar143;
  auVar107._28_4_ = uVar143;
  auVar98 = vmaxps_avx512vl(auVar98,auVar107);
  auVar99 = vmaxps_avx(auVar99,auVar98);
  auVar98._8_4_ = 0x3f7ffffa;
  auVar98._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar98._12_4_ = 0x3f7ffffa;
  auVar98._16_4_ = 0x3f7ffffa;
  auVar98._20_4_ = 0x3f7ffffa;
  auVar98._24_4_ = 0x3f7ffffa;
  auVar98._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar99,auVar98);
  auVar99 = vpmaxsd_avx2(auVar105,auVar169);
  auVar98 = vpmaxsd_avx2(auVar102,auVar160);
  auVar99 = vminps_avx(auVar99,auVar98);
  auVar98 = vpmaxsd_avx2(auVar103,auVar148);
  uVar143 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar106._4_4_ = uVar143;
  auVar106._0_4_ = uVar143;
  auVar106._8_4_ = uVar143;
  auVar106._12_4_ = uVar143;
  auVar106._16_4_ = uVar143;
  auVar106._20_4_ = uVar143;
  auVar106._24_4_ = uVar143;
  auVar106._28_4_ = uVar143;
  auVar98 = vminps_avx512vl(auVar98,auVar106);
  auVar99 = vminps_avx(auVar99,auVar98);
  auVar100._8_4_ = 0x3f800003;
  auVar100._0_8_ = 0x3f8000033f800003;
  auVar100._12_4_ = 0x3f800003;
  auVar100._16_4_ = 0x3f800003;
  auVar100._20_4_ = 0x3f800003;
  auVar100._24_4_ = 0x3f800003;
  auVar100._28_4_ = 0x3f800003;
  auVar99 = vmulps_avx512vl(auVar99,auVar100);
  auVar98 = vpbroadcastd_avx512vl();
  uVar25 = vpcmpgtd_avx512vl(auVar98,_DAT_01fe9900);
  uVar158 = vcmpps_avx512vl(local_80,auVar99,2);
  if ((byte)((byte)uVar158 & (byte)uVar25) != 0) {
    uVar79 = (ulong)(byte)((byte)uVar158 & (byte)uVar25);
    local_528 = pre->ray_space + k;
    local_4d0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar215 = ZEXT464(0xbf800000);
    local_5d8 = pre;
    do {
      lVar26 = 0;
      for (uVar72 = uVar79; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar78 = *(uint *)(prim + 2);
      uVar13 = *(uint *)(prim + lVar26 * 4 + 6);
      pGVar77 = (context->scene->geometries).items[uVar78].ptr;
      uVar72 = (ulong)*(uint *)(*(long *)&pGVar77->field_0x58 +
                               (ulong)uVar13 *
                               pGVar77[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar163 = (pGVar77->time_range).lower;
      fVar163 = pGVar77->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar163) /
                ((pGVar77->time_range).upper - fVar163));
      auVar86 = vroundss_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),9);
      auVar85 = vaddss_avx512f(ZEXT416((uint)pGVar77->fnumTimeSegments),auVar215._0_16_);
      auVar86 = vminss_avx(auVar86,auVar85);
      auVar86 = vmaxss_avx(ZEXT816(0) << 0x20,auVar86);
      fVar163 = fVar163 - auVar86._0_4_;
      _Var16 = pGVar77[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar76 = (long)(int)auVar86._0_4_ * 0x38;
      lVar26 = *(long *)(_Var16 + 0x10 + lVar76);
      lVar75 = *(long *)(_Var16 + 0x38 + lVar76);
      lVar17 = *(long *)(_Var16 + 0x48 + lVar76);
      auVar89._4_4_ = fVar163;
      auVar89._0_4_ = fVar163;
      auVar89._8_4_ = fVar163;
      auVar89._12_4_ = fVar163;
      pfVar3 = (float *)(lVar75 + uVar72 * lVar17);
      auVar198._0_4_ = fVar163 * *pfVar3;
      auVar198._4_4_ = fVar163 * pfVar3[1];
      auVar198._8_4_ = fVar163 * pfVar3[2];
      auVar198._12_4_ = fVar163 * pfVar3[3];
      pfVar3 = (float *)(lVar75 + (uVar72 + 1) * lVar17);
      auVar201._0_4_ = fVar163 * *pfVar3;
      auVar201._4_4_ = fVar163 * pfVar3[1];
      auVar201._8_4_ = fVar163 * pfVar3[2];
      auVar201._12_4_ = fVar163 * pfVar3[3];
      auVar86 = vmulps_avx512vl(auVar89,*(undefined1 (*) [16])(lVar75 + (uVar72 + 2) * lVar17));
      auVar85 = vmulps_avx512vl(auVar89,*(undefined1 (*) [16])(lVar75 + lVar17 * (uVar72 + 3)));
      lVar75 = *(long *)(_Var16 + lVar76);
      fVar163 = 1.0 - fVar163;
      auVar88._4_4_ = fVar163;
      auVar88._0_4_ = fVar163;
      auVar88._8_4_ = fVar163;
      auVar88._12_4_ = fVar163;
      local_5a0 = vfmadd231ps_fma(auVar198,auVar88,*(undefined1 (*) [16])(lVar75 + lVar26 * uVar72))
      ;
      local_5b0 = vfmadd231ps_fma(auVar201,auVar88,
                                  *(undefined1 (*) [16])(lVar75 + lVar26 * (uVar72 + 1)));
      local_5c0 = vfmadd231ps_avx512vl
                            (auVar86,auVar88,*(undefined1 (*) [16])(lVar75 + lVar26 * (uVar72 + 2)))
      ;
      _local_5d0 = vfmadd231ps_avx512vl
                             (auVar85,auVar88,*(undefined1 (*) [16])(lVar75 + lVar26 * (uVar72 + 3))
                             );
      iVar14 = (int)pGVar77[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      lVar26 = (long)iVar14 * 0x44;
      auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar87 = vsubps_avx(local_5a0,auVar86);
      uVar143 = auVar87._0_4_;
      auVar90._4_4_ = uVar143;
      auVar90._0_4_ = uVar143;
      auVar90._8_4_ = uVar143;
      auVar90._12_4_ = uVar143;
      auVar85 = vshufps_avx(auVar87,auVar87,0x55);
      aVar4 = (local_528->vx).field_0;
      aVar5 = (local_528->vy).field_0;
      fVar163 = (local_528->vz).field_0.m128[0];
      fVar141 = *(float *)((long)&(local_528->vz).field_0 + 4);
      fVar142 = *(float *)((long)&(local_528->vz).field_0 + 8);
      fVar157 = *(float *)((long)&(local_528->vz).field_0 + 0xc);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar204._0_4_ = fVar163 * auVar87._0_4_;
      auVar204._4_4_ = fVar141 * auVar87._4_4_;
      auVar204._8_4_ = fVar142 * auVar87._8_4_;
      auVar204._12_4_ = fVar157 * auVar87._12_4_;
      auVar85 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar5,auVar85);
      auVar6 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar90);
      auVar87 = vsubps_avx(local_5b0,auVar86);
      uVar143 = auVar87._0_4_;
      auVar91._4_4_ = uVar143;
      auVar91._0_4_ = uVar143;
      auVar91._8_4_ = uVar143;
      auVar91._12_4_ = uVar143;
      auVar85 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar205._0_4_ = fVar163 * auVar87._0_4_;
      auVar205._4_4_ = fVar141 * auVar87._4_4_;
      auVar205._8_4_ = fVar142 * auVar87._8_4_;
      auVar205._12_4_ = fVar157 * auVar87._12_4_;
      auVar85 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar5,auVar85);
      auVar7 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar91);
      auVar87 = vsubps_avx512vl(local_5c0,auVar86);
      uVar143 = auVar87._0_4_;
      auVar164._4_4_ = uVar143;
      auVar164._0_4_ = uVar143;
      auVar164._8_4_ = uVar143;
      auVar164._12_4_ = uVar143;
      auVar85 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar206._0_4_ = fVar163 * auVar87._0_4_;
      auVar206._4_4_ = fVar141 * auVar87._4_4_;
      auVar206._8_4_ = fVar142 * auVar87._8_4_;
      auVar206._12_4_ = fVar157 * auVar87._12_4_;
      auVar85 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar5,auVar85);
      auVar87 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar164);
      auVar85 = vsubps_avx512vl(_local_5d0,auVar86);
      uVar143 = auVar85._0_4_;
      auVar159._4_4_ = uVar143;
      auVar159._0_4_ = uVar143;
      auVar159._8_4_ = uVar143;
      auVar159._12_4_ = uVar143;
      auVar86 = vshufps_avx(auVar85,auVar85,0x55);
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      auVar208._0_4_ = fVar163 * auVar85._0_4_;
      auVar208._4_4_ = fVar141 * auVar85._4_4_;
      auVar208._8_4_ = fVar142 * auVar85._8_4_;
      auVar208._12_4_ = fVar157 * auVar85._12_4_;
      auVar86 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar5,auVar86);
      auVar8 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar4,auVar159);
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar26);
      uVar143 = auVar6._0_4_;
      local_2e0._4_4_ = uVar143;
      local_2e0._0_4_ = uVar143;
      local_2e0._8_4_ = uVar143;
      local_2e0._12_4_ = uVar143;
      local_2e0._16_4_ = uVar143;
      local_2e0._20_4_ = uVar143;
      local_2e0._24_4_ = uVar143;
      local_2e0._28_4_ = uVar143;
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x484);
      auVar148 = auVar216._0_32_;
      local_300 = vpermps_avx512vl(auVar148,ZEXT1632(auVar6));
      uVar143 = auVar7._0_4_;
      auVar174._4_4_ = uVar143;
      auVar174._0_4_ = uVar143;
      auVar174._8_4_ = uVar143;
      auVar174._12_4_ = uVar143;
      local_320._16_4_ = uVar143;
      local_320._0_16_ = auVar174;
      local_320._20_4_ = uVar143;
      local_320._24_4_ = uVar143;
      local_320._28_4_ = uVar143;
      local_340 = vpermps_avx512vl(auVar148,ZEXT1632(auVar7));
      auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x908);
      local_360 = vbroadcastss_avx512vl(auVar87);
      local_380 = vpermps_avx512vl(auVar148,ZEXT1632(auVar87));
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0xd8c);
      uVar143 = auVar8._0_4_;
      local_3a0._4_4_ = uVar143;
      local_3a0._0_4_ = uVar143;
      fStack_398 = (float)uVar143;
      fStack_394 = (float)uVar143;
      fStack_390 = (float)uVar143;
      fStack_38c = (float)uVar143;
      fStack_388 = (float)uVar143;
      register0x0000139c = uVar143;
      _local_3c0 = vpermps_avx512vl(auVar148,ZEXT1632(auVar8));
      auVar100 = vmulps_avx512vl(_local_3a0,auVar106);
      auVar101 = vmulps_avx512vl(_local_3c0,auVar106);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,local_360);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,local_380);
      auVar86 = vfmadd231ps_fma(auVar100,auVar98,local_320);
      auVar102 = vfmadd231ps_avx512vl(auVar101,auVar98,local_340);
      auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar99,local_2e0);
      auVar192 = ZEXT3264(auVar103);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar26);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x484);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x908);
      auVar96 = vfmadd231ps_avx512vl(auVar102,auVar99,local_300);
      auVar186 = ZEXT3264(auVar96);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0xd8c);
      auVar97 = vmulps_avx512vl(_local_3a0,auVar102);
      auVar104 = vmulps_avx512vl(_local_3c0,auVar102);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar105,local_360);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar105,local_380);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar101,local_320);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,local_340);
      auVar9 = vfmadd231ps_fma(auVar97,auVar100,local_2e0);
      auVar196 = ZEXT1664(auVar9);
      auVar10 = vfmadd231ps_fma(auVar104,auVar100,local_300);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar9),auVar103);
      auVar104 = vsubps_avx512vl(ZEXT1632(auVar10),auVar96);
      auVar92 = vmulps_avx512vl(auVar96,auVar97);
      auVar93 = vmulps_avx512vl(auVar103,auVar104);
      auVar92 = vsubps_avx512vl(auVar92,auVar93);
      auVar86 = vshufps_avx(local_5a0,local_5a0,0xff);
      uVar158 = auVar86._0_8_;
      local_a0._8_8_ = uVar158;
      local_a0._0_8_ = uVar158;
      local_a0._16_8_ = uVar158;
      local_a0._24_8_ = uVar158;
      auVar86 = vshufps_avx(local_5b0,local_5b0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar86);
      auVar86 = vshufps_avx512vl(local_5c0,local_5c0,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar86);
      auVar86 = vshufps_avx512vl(_local_5d0,_local_5d0,0xff);
      uVar158 = auVar86._0_8_;
      local_100._8_8_ = uVar158;
      local_100._0_8_ = uVar158;
      local_100._16_8_ = uVar158;
      local_100._24_8_ = uVar158;
      auVar93 = vmulps_avx512vl(local_100,auVar106);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar107,local_e0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,local_c0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,local_a0);
      auVar94 = vmulps_avx512vl(local_100,auVar102);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar105,local_e0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_c0);
      auVar11 = vfmadd231ps_fma(auVar94,auVar100,local_a0);
      auVar94 = vmulps_avx512vl(auVar104,auVar104);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar97,auVar97);
      auVar95 = vmaxps_avx512vl(auVar93,ZEXT1632(auVar11));
      auVar95 = vmulps_avx512vl(auVar95,auVar95);
      auVar94 = vmulps_avx512vl(auVar95,auVar94);
      auVar92 = vmulps_avx512vl(auVar92,auVar92);
      uVar158 = vcmpps_avx512vl(auVar92,auVar94,2);
      auVar86 = vblendps_avx(auVar6,local_5a0,8);
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar85 = vandps_avx512vl(auVar86,auVar88);
      auVar86 = vblendps_avx(auVar7,local_5b0,8);
      auVar86 = vandps_avx512vl(auVar86,auVar88);
      auVar85 = vmaxps_avx(auVar85,auVar86);
      auVar86 = vblendps_avx(auVar87,local_5c0,8);
      auVar89 = vandps_avx512vl(auVar86,auVar88);
      auVar86 = vblendps_avx(auVar8,_local_5d0,8);
      auVar86 = vandps_avx512vl(auVar86,auVar88);
      auVar86 = vmaxps_avx(auVar89,auVar86);
      auVar86 = vmaxps_avx(auVar85,auVar86);
      auVar85 = vmovshdup_avx(auVar86);
      auVar85 = vmaxss_avx(auVar85,auVar86);
      auVar86 = vshufpd_avx(auVar86,auVar86,1);
      auVar86 = vmaxss_avx(auVar86,auVar85);
      local_550 = vcvtsi2ss_avx512f(local_5c0,iVar14);
      auVar200._0_4_ = local_550._0_4_;
      auVar200._4_4_ = auVar200._0_4_;
      auVar200._8_4_ = auVar200._0_4_;
      auVar200._12_4_ = auVar200._0_4_;
      auVar200._16_4_ = auVar200._0_4_;
      auVar200._20_4_ = auVar200._0_4_;
      auVar200._24_4_ = auVar200._0_4_;
      auVar200._28_4_ = auVar200._0_4_;
      uVar25 = vcmpps_avx512vl(auVar200,_DAT_01faff40,0xe);
      bVar80 = (byte)uVar158 & (byte)uVar25;
      fVar163 = auVar86._0_4_ * 4.7683716e-07;
      local_500._0_16_ = ZEXT416((uint)fVar163);
      auVar92 = auVar214._0_32_;
      local_140 = vpermps_avx512vl(auVar92,ZEXT1632(auVar6));
      local_160 = vpermps_avx512vl(auVar92,ZEXT1632(auVar7));
      local_180 = vpermps_avx512vl(auVar92,ZEXT1632(auVar87));
      local_1a0 = vpermps_avx512vl(auVar92,ZEXT1632(auVar8));
      local_4a0 = *(undefined4 *)(ray + k * 4 + 0x30);
      uStack_49c = 0;
      uStack_498 = 0;
      uStack_494 = 0;
      if (bVar80 != 0) {
        auVar102 = vmulps_avx512vl(local_1a0,auVar102);
        auVar105 = vfmadd213ps_avx512vl(auVar105,local_180,auVar102);
        auVar101 = vfmadd213ps_avx512vl(auVar101,local_160,auVar105);
        auVar101 = vfmadd213ps_avx512vl(auVar100,local_140,auVar101);
        auVar106 = vmulps_avx512vl(local_1a0,auVar106);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar106);
        auVar105 = vfmadd213ps_avx512vl(auVar98,local_160,auVar107);
        auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1210);
        auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1694);
        auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1b18);
        auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1f9c);
        auVar105 = vfmadd213ps_avx512vl(auVar99,local_140,auVar105);
        auVar99 = vmulps_avx512vl(_local_3a0,auVar100);
        auVar102 = vmulps_avx512vl(_local_3c0,auVar100);
        auVar100 = vmulps_avx512vl(local_1a0,auVar100);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar106,local_360);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,local_380);
        auVar106 = vfmadd231ps_avx512vl(auVar100,local_180,auVar106);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,local_320);
        auVar100 = vfmadd231ps_avx512vl(auVar102,auVar107,local_340);
        auVar102 = vfmadd231ps_avx512vl(auVar106,local_160,auVar107);
        auVar86 = vfmadd231ps_fma(auVar99,auVar98,local_2e0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,local_300);
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1210);
        auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1b18);
        auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1f9c);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_140,auVar98);
        auVar98 = vmulps_avx512vl(_local_3a0,auVar106);
        auVar92 = vmulps_avx512vl(_local_3c0,auVar106);
        auVar106 = vmulps_avx512vl(local_1a0,auVar106);
        auVar94 = vfmadd231ps_avx512vl(auVar98,auVar107,local_360);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar107,local_380);
        auVar107 = vfmadd231ps_avx512vl(auVar106,local_180,auVar107);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1694);
        auVar106 = vfmadd231ps_avx512vl(auVar94,auVar98,local_320);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar98,local_340);
        auVar98 = vfmadd231ps_avx512vl(auVar107,local_160,auVar98);
        auVar85 = vfmadd231ps_fma(auVar106,auVar99,local_2e0);
        auVar107 = vfmadd231ps_avx512vl(auVar92,auVar99,local_300);
        auVar106 = vfmadd231ps_avx512vl(auVar98,local_140,auVar99);
        auVar215 = ZEXT1664(auVar215._0_16_);
        auVar216 = ZEXT3264(auVar148);
        auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
        auVar214 = ZEXT3264(auVar99);
        auVar209._8_4_ = 0x7fffffff;
        auVar209._0_8_ = 0x7fffffff7fffffff;
        auVar209._12_4_ = 0x7fffffff;
        auVar209._16_4_ = 0x7fffffff;
        auVar209._20_4_ = 0x7fffffff;
        auVar209._24_4_ = 0x7fffffff;
        auVar209._28_4_ = 0x7fffffff;
        auVar99 = vandps_avx(ZEXT1632(auVar86),auVar209);
        auVar98 = vandps_avx(auVar100,auVar209);
        auVar98 = vmaxps_avx(auVar99,auVar98);
        auVar99 = vandps_avx(auVar102,auVar209);
        auVar99 = vmaxps_avx(auVar98,auVar99);
        auVar202._4_4_ = fVar163;
        auVar202._0_4_ = fVar163;
        auVar202._8_4_ = fVar163;
        auVar202._12_4_ = fVar163;
        auVar202._16_4_ = fVar163;
        auVar202._20_4_ = fVar163;
        auVar202._24_4_ = fVar163;
        auVar202._28_4_ = fVar163;
        uVar72 = vcmpps_avx512vl(auVar99,auVar202,1);
        bVar19 = (bool)((byte)uVar72 & 1);
        auVar108._0_4_ = (float)((uint)bVar19 * auVar97._0_4_ | (uint)!bVar19 * auVar86._0_4_);
        bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar19 * auVar97._4_4_ | (uint)!bVar19 * auVar86._4_4_);
        bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar19 * auVar97._8_4_ | (uint)!bVar19 * auVar86._8_4_);
        bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar19 * auVar97._12_4_ | (uint)!bVar19 * auVar86._12_4_);
        fVar163 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar97._16_4_);
        auVar108._16_4_ = fVar163;
        fVar141 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar97._20_4_);
        auVar108._20_4_ = fVar141;
        fVar142 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar97._24_4_);
        auVar108._24_4_ = fVar142;
        auVar108._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar97._28_4_;
        bVar19 = (bool)((byte)uVar72 & 1);
        auVar109._0_4_ = (float)((uint)bVar19 * auVar104._0_4_ | (uint)!bVar19 * auVar100._0_4_);
        bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar19 * auVar104._4_4_ | (uint)!bVar19 * auVar100._4_4_);
        bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar19 * auVar104._8_4_ | (uint)!bVar19 * auVar100._8_4_);
        bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar19 * auVar104._12_4_ | (uint)!bVar19 * auVar100._12_4_);
        bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar19 * auVar104._16_4_ | (uint)!bVar19 * auVar100._16_4_);
        bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar19 * auVar104._20_4_ | (uint)!bVar19 * auVar100._20_4_);
        bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar19 * auVar104._24_4_ | (uint)!bVar19 * auVar100._24_4_);
        bVar19 = SUB81(uVar72 >> 7,0);
        auVar109._28_4_ = (uint)bVar19 * auVar104._28_4_ | (uint)!bVar19 * auVar100._28_4_;
        auVar99 = vandps_avx(auVar209,ZEXT1632(auVar85));
        auVar98 = vandps_avx(auVar107,auVar209);
        auVar98 = vmaxps_avx(auVar99,auVar98);
        auVar99 = vandps_avx(auVar106,auVar209);
        auVar99 = vmaxps_avx(auVar98,auVar99);
        uVar72 = vcmpps_avx512vl(auVar99,auVar202,1);
        bVar19 = (bool)((byte)uVar72 & 1);
        auVar110._0_4_ = (float)((uint)bVar19 * auVar97._0_4_ | (uint)!bVar19 * auVar85._0_4_);
        bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar19 * auVar97._4_4_ | (uint)!bVar19 * auVar85._4_4_);
        bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar19 * auVar97._8_4_ | (uint)!bVar19 * auVar85._8_4_);
        bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar19 * auVar97._12_4_ | (uint)!bVar19 * auVar85._12_4_);
        fVar162 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar97._16_4_);
        auVar110._16_4_ = fVar162;
        fVar172 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar97._20_4_);
        auVar110._20_4_ = fVar172;
        fVar157 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar97._24_4_);
        auVar110._24_4_ = fVar157;
        uVar73 = (uint)(byte)(uVar72 >> 7) * auVar97._28_4_;
        auVar110._28_4_ = uVar73;
        bVar19 = (bool)((byte)uVar72 & 1);
        auVar111._0_4_ = (float)((uint)bVar19 * auVar104._0_4_ | (uint)!bVar19 * auVar107._0_4_);
        bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar19 * auVar104._4_4_ | (uint)!bVar19 * auVar107._4_4_);
        bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar19 * auVar104._8_4_ | (uint)!bVar19 * auVar107._8_4_);
        bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar19 * auVar104._12_4_ | (uint)!bVar19 * auVar107._12_4_);
        bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar19 * auVar104._16_4_ | (uint)!bVar19 * auVar107._16_4_);
        bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar19 * auVar104._20_4_ | (uint)!bVar19 * auVar107._20_4_);
        bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar19 * auVar104._24_4_ | (uint)!bVar19 * auVar107._24_4_);
        bVar19 = SUB81(uVar72 >> 7,0);
        auVar111._28_4_ = (uint)bVar19 * auVar104._28_4_ | (uint)!bVar19 * auVar107._28_4_;
        auVar90 = vxorps_avx512vl(auVar174,auVar174);
        auVar99 = vfmadd213ps_avx512vl(auVar108,auVar108,ZEXT1632(auVar90));
        auVar86 = vfmadd231ps_fma(auVar99,auVar109,auVar109);
        auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
        fVar83 = auVar99._0_4_;
        fVar84 = auVar99._4_4_;
        fVar133 = auVar99._8_4_;
        fVar173 = auVar99._12_4_;
        fVar134 = auVar99._16_4_;
        fVar135 = auVar99._20_4_;
        fVar137 = auVar99._24_4_;
        auVar34._4_4_ = fVar84 * fVar84 * fVar84 * auVar86._4_4_ * -0.5;
        auVar34._0_4_ = fVar83 * fVar83 * fVar83 * auVar86._0_4_ * -0.5;
        auVar34._8_4_ = fVar133 * fVar133 * fVar133 * auVar86._8_4_ * -0.5;
        auVar34._12_4_ = fVar173 * fVar173 * fVar173 * auVar86._12_4_ * -0.5;
        auVar34._16_4_ = fVar134 * fVar134 * fVar134 * -0.0;
        auVar34._20_4_ = fVar135 * fVar135 * fVar135 * -0.0;
        auVar34._24_4_ = fVar137 * fVar137 * fVar137 * -0.0;
        auVar34._28_4_ = auVar106._28_4_;
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar99 = vfmadd231ps_avx512vl(auVar34,auVar98,auVar99);
        auVar35._4_4_ = auVar109._4_4_ * auVar99._4_4_;
        auVar35._0_4_ = auVar109._0_4_ * auVar99._0_4_;
        auVar35._8_4_ = auVar109._8_4_ * auVar99._8_4_;
        auVar35._12_4_ = auVar109._12_4_ * auVar99._12_4_;
        auVar35._16_4_ = auVar109._16_4_ * auVar99._16_4_;
        auVar35._20_4_ = auVar109._20_4_ * auVar99._20_4_;
        auVar35._24_4_ = auVar109._24_4_ * auVar99._24_4_;
        auVar35._28_4_ = 0;
        auVar36._4_4_ = auVar99._4_4_ * -auVar108._4_4_;
        auVar36._0_4_ = auVar99._0_4_ * -auVar108._0_4_;
        auVar36._8_4_ = auVar99._8_4_ * -auVar108._8_4_;
        auVar36._12_4_ = auVar99._12_4_ * -auVar108._12_4_;
        auVar36._16_4_ = auVar99._16_4_ * -fVar163;
        auVar36._20_4_ = auVar99._20_4_ * -fVar141;
        auVar36._24_4_ = auVar99._24_4_ * -fVar142;
        auVar36._28_4_ = auVar109._28_4_;
        auVar99 = vmulps_avx512vl(auVar99,ZEXT1632(auVar90));
        auVar97 = ZEXT1632(auVar90);
        auVar107 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar97);
        auVar86 = vfmadd231ps_fma(auVar107,auVar111,auVar111);
        auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
        fVar163 = auVar107._0_4_;
        fVar141 = auVar107._4_4_;
        fVar142 = auVar107._8_4_;
        fVar83 = auVar107._12_4_;
        fVar84 = auVar107._16_4_;
        fVar133 = auVar107._20_4_;
        fVar173 = auVar107._24_4_;
        auVar37._4_4_ = fVar141 * fVar141 * fVar141 * auVar86._4_4_ * -0.5;
        auVar37._0_4_ = fVar163 * fVar163 * fVar163 * auVar86._0_4_ * -0.5;
        auVar37._8_4_ = fVar142 * fVar142 * fVar142 * auVar86._8_4_ * -0.5;
        auVar37._12_4_ = fVar83 * fVar83 * fVar83 * auVar86._12_4_ * -0.5;
        auVar37._16_4_ = fVar84 * fVar84 * fVar84 * -0.0;
        auVar37._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
        auVar37._24_4_ = fVar173 * fVar173 * fVar173 * -0.0;
        auVar37._28_4_ = 0;
        auVar98 = vfmadd231ps_avx512vl(auVar37,auVar98,auVar107);
        auVar38._4_4_ = auVar111._4_4_ * auVar98._4_4_;
        auVar38._0_4_ = auVar111._0_4_ * auVar98._0_4_;
        auVar38._8_4_ = auVar111._8_4_ * auVar98._8_4_;
        auVar38._12_4_ = auVar111._12_4_ * auVar98._12_4_;
        auVar38._16_4_ = auVar111._16_4_ * auVar98._16_4_;
        auVar38._20_4_ = auVar111._20_4_ * auVar98._20_4_;
        auVar38._24_4_ = auVar111._24_4_ * auVar98._24_4_;
        auVar38._28_4_ = auVar107._28_4_;
        auVar39._4_4_ = -auVar110._4_4_ * auVar98._4_4_;
        auVar39._0_4_ = -auVar110._0_4_ * auVar98._0_4_;
        auVar39._8_4_ = -auVar110._8_4_ * auVar98._8_4_;
        auVar39._12_4_ = -auVar110._12_4_ * auVar98._12_4_;
        auVar39._16_4_ = -fVar162 * auVar98._16_4_;
        auVar39._20_4_ = -fVar172 * auVar98._20_4_;
        auVar39._24_4_ = -fVar157 * auVar98._24_4_;
        auVar39._28_4_ = uVar73 ^ 0x80000000;
        auVar98 = vmulps_avx512vl(auVar98,auVar97);
        auVar86 = vfmadd213ps_fma(auVar35,auVar93,auVar103);
        auVar85 = vfmadd213ps_fma(auVar36,auVar93,auVar96);
        auVar107 = vfmadd213ps_avx512vl(auVar99,auVar93,auVar105);
        auVar106 = vfmadd213ps_avx512vl(auVar38,ZEXT1632(auVar11),ZEXT1632(auVar9));
        auVar88 = vfnmadd213ps_fma(auVar35,auVar93,auVar103);
        auVar102 = ZEXT1632(auVar11);
        auVar87 = vfmadd213ps_fma(auVar39,auVar102,ZEXT1632(auVar10));
        auVar89 = vfnmadd213ps_fma(auVar36,auVar93,auVar96);
        auVar6 = vfmadd213ps_fma(auVar98,auVar102,auVar101);
        auVar100 = vfnmadd231ps_avx512vl(auVar105,auVar93,auVar99);
        auVar9 = vfnmadd213ps_fma(auVar38,auVar102,ZEXT1632(auVar9));
        auVar10 = vfnmadd213ps_fma(auVar39,auVar102,ZEXT1632(auVar10));
        auVar159 = vfnmadd231ps_fma(auVar101,ZEXT1632(auVar11),auVar98);
        auVar98 = vsubps_avx512vl(auVar106,ZEXT1632(auVar88));
        auVar99 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar89));
        auVar101 = vsubps_avx512vl(ZEXT1632(auVar6),auVar100);
        auVar105 = vmulps_avx512vl(auVar99,auVar100);
        auVar7 = vfmsub231ps_fma(auVar105,ZEXT1632(auVar89),auVar101);
        auVar40._4_4_ = auVar88._4_4_ * auVar101._4_4_;
        auVar40._0_4_ = auVar88._0_4_ * auVar101._0_4_;
        auVar40._8_4_ = auVar88._8_4_ * auVar101._8_4_;
        auVar40._12_4_ = auVar88._12_4_ * auVar101._12_4_;
        auVar40._16_4_ = auVar101._16_4_ * 0.0;
        auVar40._20_4_ = auVar101._20_4_ * 0.0;
        auVar40._24_4_ = auVar101._24_4_ * 0.0;
        auVar40._28_4_ = auVar101._28_4_;
        auVar101 = vfmsub231ps_avx512vl(auVar40,auVar100,auVar98);
        auVar41._4_4_ = auVar89._4_4_ * auVar98._4_4_;
        auVar41._0_4_ = auVar89._0_4_ * auVar98._0_4_;
        auVar41._8_4_ = auVar89._8_4_ * auVar98._8_4_;
        auVar41._12_4_ = auVar89._12_4_ * auVar98._12_4_;
        auVar41._16_4_ = auVar98._16_4_ * 0.0;
        auVar41._20_4_ = auVar98._20_4_ * 0.0;
        auVar41._24_4_ = auVar98._24_4_ * 0.0;
        auVar41._28_4_ = auVar98._28_4_;
        auVar8 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar88),auVar99);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar97,auVar101);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,ZEXT1632(auVar7));
        auVar104 = ZEXT1632(auVar90);
        uVar72 = vcmpps_avx512vl(auVar99,auVar104,2);
        bVar71 = (byte)uVar72;
        fVar83 = (float)((uint)(bVar71 & 1) * auVar86._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar9._0_4_);
        bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
        fVar133 = (float)((uint)bVar19 * auVar86._4_4_ | (uint)!bVar19 * auVar9._4_4_);
        bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
        fVar134 = (float)((uint)bVar19 * auVar86._8_4_ | (uint)!bVar19 * auVar9._8_4_);
        bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
        fVar137 = (float)((uint)bVar19 * auVar86._12_4_ | (uint)!bVar19 * auVar9._12_4_);
        auVar105 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar134,CONCAT44(fVar133,fVar83))));
        fVar84 = (float)((uint)(bVar71 & 1) * auVar85._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar10._0_4_);
        bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
        fVar173 = (float)((uint)bVar19 * auVar85._4_4_ | (uint)!bVar19 * auVar10._4_4_);
        bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
        fVar135 = (float)((uint)bVar19 * auVar85._8_4_ | (uint)!bVar19 * auVar10._8_4_);
        bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
        fVar138 = (float)((uint)bVar19 * auVar85._12_4_ | (uint)!bVar19 * auVar10._12_4_);
        auVar102 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(fVar173,fVar84))));
        auVar112._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar107._0_4_ |
                    (uint)!(bool)(bVar71 & 1) * auVar159._0_4_);
        bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar19 * auVar107._4_4_ | (uint)!bVar19 * auVar159._4_4_);
        bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar19 * auVar107._8_4_ | (uint)!bVar19 * auVar159._8_4_);
        bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar19 * auVar107._12_4_ | (uint)!bVar19 * auVar159._12_4_);
        fVar163 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar107._16_4_);
        auVar112._16_4_ = fVar163;
        fVar142 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar107._20_4_);
        auVar112._20_4_ = fVar142;
        fVar141 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar107._24_4_);
        auVar112._24_4_ = fVar141;
        iVar1 = (uint)(byte)(uVar72 >> 7) * auVar107._28_4_;
        auVar112._28_4_ = iVar1;
        auVar98 = vblendmps_avx512vl(ZEXT1632(auVar88),auVar106);
        auVar113._0_4_ =
             (uint)(bVar71 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar7._0_4_;
        bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar19 * auVar98._4_4_ | (uint)!bVar19 * auVar7._4_4_;
        bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar19 * auVar98._8_4_ | (uint)!bVar19 * auVar7._8_4_;
        bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar19 * auVar98._12_4_ | (uint)!bVar19 * auVar7._12_4_;
        auVar113._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar98._16_4_;
        auVar113._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar98._20_4_;
        auVar113._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar98._24_4_;
        auVar113._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar98._28_4_;
        auVar98 = vblendmps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar87));
        auVar114._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar85._0_4_)
        ;
        bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar19 * auVar98._4_4_ | (uint)!bVar19 * auVar85._4_4_);
        bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar19 * auVar98._8_4_ | (uint)!bVar19 * auVar85._8_4_);
        bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar19 * auVar98._12_4_ | (uint)!bVar19 * auVar85._12_4_);
        fVar172 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar98._16_4_);
        auVar114._16_4_ = fVar172;
        fVar162 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar98._20_4_);
        auVar114._20_4_ = fVar162;
        fVar157 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar98._24_4_);
        auVar114._24_4_ = fVar157;
        auVar114._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar98._28_4_;
        auVar98 = vblendmps_avx512vl(auVar100,ZEXT1632(auVar6));
        auVar115._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar107._0_4_
                    );
        bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar19 * auVar98._4_4_ | (uint)!bVar19 * auVar107._4_4_);
        bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar19 * auVar98._8_4_ | (uint)!bVar19 * auVar107._8_4_);
        bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar19 * auVar98._12_4_ | (uint)!bVar19 * auVar107._12_4_);
        bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar19 * auVar98._16_4_ | (uint)!bVar19 * auVar107._16_4_);
        bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar19 * auVar98._20_4_ | (uint)!bVar19 * auVar107._20_4_);
        bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar19 * auVar98._24_4_ | (uint)!bVar19 * auVar107._24_4_);
        bVar19 = SUB81(uVar72 >> 7,0);
        auVar115._28_4_ = (uint)bVar19 * auVar98._28_4_ | (uint)!bVar19 * auVar107._28_4_;
        auVar116._0_4_ =
             (uint)(bVar71 & 1) * (int)auVar88._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar106._0_4_;
        bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar19 * (int)auVar88._4_4_ | (uint)!bVar19 * auVar106._4_4_;
        bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar19 * (int)auVar88._8_4_ | (uint)!bVar19 * auVar106._8_4_;
        bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar19 * (int)auVar88._12_4_ | (uint)!bVar19 * auVar106._12_4_;
        auVar116._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar106._16_4_;
        auVar116._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar106._20_4_;
        auVar116._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar106._24_4_;
        auVar116._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar106._28_4_;
        bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
        bVar21 = (bool)((byte)(uVar72 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar117._0_4_ =
             (uint)(bVar71 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar6._0_4_;
        bVar20 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar20 * auVar100._4_4_ | (uint)!bVar20 * auVar6._4_4_;
        bVar20 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar20 * auVar100._8_4_ | (uint)!bVar20 * auVar6._8_4_;
        bVar20 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar20 * auVar100._12_4_ | (uint)!bVar20 * auVar6._12_4_;
        auVar117._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar100._16_4_;
        auVar117._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar100._20_4_;
        auVar117._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar100._24_4_;
        iVar2 = (uint)(byte)(uVar72 >> 7) * auVar100._28_4_;
        auVar117._28_4_ = iVar2;
        auVar103 = vsubps_avx512vl(auVar116,auVar105);
        auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar89._12_4_ |
                                                (uint)!bVar22 * auVar87._12_4_,
                                                CONCAT48((uint)bVar21 * (int)auVar89._8_4_ |
                                                         (uint)!bVar21 * auVar87._8_4_,
                                                         CONCAT44((uint)bVar19 * (int)auVar89._4_4_
                                                                  | (uint)!bVar19 * auVar87._4_4_,
                                                                  (uint)(bVar71 & 1) *
                                                                  (int)auVar89._0_4_ |
                                                                  (uint)!(bool)(bVar71 & 1) *
                                                                  auVar87._0_4_)))),auVar102);
        auVar192 = ZEXT3264(auVar98);
        auVar107 = vsubps_avx(auVar117,auVar112);
        auVar106 = vsubps_avx(auVar105,auVar113);
        auVar196 = ZEXT3264(auVar106);
        auVar100 = vsubps_avx(auVar102,auVar114);
        auVar101 = vsubps_avx(auVar112,auVar115);
        auVar42._4_4_ = auVar107._4_4_ * fVar133;
        auVar42._0_4_ = auVar107._0_4_ * fVar83;
        auVar42._8_4_ = auVar107._8_4_ * fVar134;
        auVar42._12_4_ = auVar107._12_4_ * fVar137;
        auVar42._16_4_ = auVar107._16_4_ * 0.0;
        auVar42._20_4_ = auVar107._20_4_ * 0.0;
        auVar42._24_4_ = auVar107._24_4_ * 0.0;
        auVar42._28_4_ = iVar2;
        auVar86 = vfmsub231ps_fma(auVar42,auVar112,auVar103);
        auVar43._4_4_ = fVar173 * auVar103._4_4_;
        auVar43._0_4_ = fVar84 * auVar103._0_4_;
        auVar43._8_4_ = fVar135 * auVar103._8_4_;
        auVar43._12_4_ = fVar138 * auVar103._12_4_;
        auVar43._16_4_ = auVar103._16_4_ * 0.0;
        auVar43._20_4_ = auVar103._20_4_ * 0.0;
        auVar43._24_4_ = auVar103._24_4_ * 0.0;
        auVar43._28_4_ = auVar99._28_4_;
        auVar85 = vfmsub231ps_fma(auVar43,auVar105,auVar98);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar104,ZEXT1632(auVar86));
        auVar182._0_4_ = auVar98._0_4_ * auVar112._0_4_;
        auVar182._4_4_ = auVar98._4_4_ * auVar112._4_4_;
        auVar182._8_4_ = auVar98._8_4_ * auVar112._8_4_;
        auVar182._12_4_ = auVar98._12_4_ * auVar112._12_4_;
        auVar182._16_4_ = auVar98._16_4_ * fVar163;
        auVar182._20_4_ = auVar98._20_4_ * fVar142;
        auVar182._24_4_ = auVar98._24_4_ * fVar141;
        auVar182._28_4_ = 0;
        auVar86 = vfmsub231ps_fma(auVar182,auVar102,auVar107);
        auVar96 = vfmadd231ps_avx512vl(auVar99,auVar104,ZEXT1632(auVar86));
        auVar99 = vmulps_avx512vl(auVar101,auVar113);
        auVar99 = vfmsub231ps_avx512vl(auVar99,auVar106,auVar115);
        auVar44._4_4_ = auVar100._4_4_ * auVar115._4_4_;
        auVar44._0_4_ = auVar100._0_4_ * auVar115._0_4_;
        auVar44._8_4_ = auVar100._8_4_ * auVar115._8_4_;
        auVar44._12_4_ = auVar100._12_4_ * auVar115._12_4_;
        auVar44._16_4_ = auVar100._16_4_ * auVar115._16_4_;
        auVar44._20_4_ = auVar100._20_4_ * auVar115._20_4_;
        auVar44._24_4_ = auVar100._24_4_ * auVar115._24_4_;
        auVar44._28_4_ = auVar115._28_4_;
        auVar86 = vfmsub231ps_fma(auVar44,auVar114,auVar101);
        auVar183._0_4_ = auVar114._0_4_ * auVar106._0_4_;
        auVar183._4_4_ = auVar114._4_4_ * auVar106._4_4_;
        auVar183._8_4_ = auVar114._8_4_ * auVar106._8_4_;
        auVar183._12_4_ = auVar114._12_4_ * auVar106._12_4_;
        auVar183._16_4_ = fVar172 * auVar106._16_4_;
        auVar183._20_4_ = fVar162 * auVar106._20_4_;
        auVar183._24_4_ = fVar157 * auVar106._24_4_;
        auVar183._28_4_ = 0;
        auVar85 = vfmsub231ps_fma(auVar183,auVar100,auVar113);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar104,auVar99);
        auVar97 = vfmadd231ps_avx512vl(auVar99,auVar104,ZEXT1632(auVar86));
        auVar186 = ZEXT3264(auVar97);
        auVar99 = vmaxps_avx(auVar96,auVar97);
        uVar158 = vcmpps_avx512vl(auVar99,auVar104,2);
        bVar80 = bVar80 & (byte)uVar158;
        if (bVar80 != 0) {
          uVar143 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar210._4_4_ = uVar143;
          auVar210._0_4_ = uVar143;
          auVar210._8_4_ = uVar143;
          auVar210._12_4_ = uVar143;
          auVar210._16_4_ = uVar143;
          auVar210._20_4_ = uVar143;
          auVar210._24_4_ = uVar143;
          auVar210._28_4_ = uVar143;
          auVar213 = ZEXT3264(auVar210);
          auVar45._4_4_ = auVar101._4_4_ * auVar98._4_4_;
          auVar45._0_4_ = auVar101._0_4_ * auVar98._0_4_;
          auVar45._8_4_ = auVar101._8_4_ * auVar98._8_4_;
          auVar45._12_4_ = auVar101._12_4_ * auVar98._12_4_;
          auVar45._16_4_ = auVar101._16_4_ * auVar98._16_4_;
          auVar45._20_4_ = auVar101._20_4_ * auVar98._20_4_;
          auVar45._24_4_ = auVar101._24_4_ * auVar98._24_4_;
          auVar45._28_4_ = auVar99._28_4_;
          auVar6 = vfmsub231ps_fma(auVar45,auVar100,auVar107);
          auVar46._4_4_ = auVar107._4_4_ * auVar106._4_4_;
          auVar46._0_4_ = auVar107._0_4_ * auVar106._0_4_;
          auVar46._8_4_ = auVar107._8_4_ * auVar106._8_4_;
          auVar46._12_4_ = auVar107._12_4_ * auVar106._12_4_;
          auVar46._16_4_ = auVar107._16_4_ * auVar106._16_4_;
          auVar46._20_4_ = auVar107._20_4_ * auVar106._20_4_;
          auVar46._24_4_ = auVar107._24_4_ * auVar106._24_4_;
          auVar46._28_4_ = auVar107._28_4_;
          auVar87 = vfmsub231ps_fma(auVar46,auVar103,auVar101);
          auVar47._4_4_ = auVar100._4_4_ * auVar103._4_4_;
          auVar47._0_4_ = auVar100._0_4_ * auVar103._0_4_;
          auVar47._8_4_ = auVar100._8_4_ * auVar103._8_4_;
          auVar47._12_4_ = auVar100._12_4_ * auVar103._12_4_;
          auVar47._16_4_ = auVar100._16_4_ * auVar103._16_4_;
          auVar47._20_4_ = auVar100._20_4_ * auVar103._20_4_;
          auVar47._24_4_ = auVar100._24_4_ * auVar103._24_4_;
          auVar47._28_4_ = auVar100._28_4_;
          auVar7 = vfmsub231ps_fma(auVar47,auVar106,auVar98);
          auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar87),ZEXT1632(auVar7));
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT1632(auVar6),ZEXT1232(ZEXT412(0)) << 0x20)
          ;
          auVar99 = vrcp14ps_avx512vl(ZEXT1632(auVar85));
          auVar27._8_4_ = 0x3f800000;
          auVar27._0_8_ = 0x3f8000003f800000;
          auVar27._12_4_ = 0x3f800000;
          auVar27._16_4_ = 0x3f800000;
          auVar27._20_4_ = 0x3f800000;
          auVar27._24_4_ = 0x3f800000;
          auVar27._28_4_ = 0x3f800000;
          auVar98 = vfnmadd213ps_avx512vl(auVar99,ZEXT1632(auVar85),auVar27);
          auVar86 = vfmadd132ps_fma(auVar98,auVar99,auVar99);
          auVar192 = ZEXT1664(auVar86);
          auVar48._4_4_ = auVar7._4_4_ * auVar112._4_4_;
          auVar48._0_4_ = auVar7._0_4_ * auVar112._0_4_;
          auVar48._8_4_ = auVar7._8_4_ * auVar112._8_4_;
          auVar48._12_4_ = auVar7._12_4_ * auVar112._12_4_;
          auVar48._16_4_ = fVar163 * 0.0;
          auVar48._20_4_ = fVar142 * 0.0;
          auVar48._24_4_ = fVar141 * 0.0;
          auVar48._28_4_ = iVar1;
          auVar87 = vfmadd231ps_fma(auVar48,auVar102,ZEXT1632(auVar87));
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar105,ZEXT1632(auVar6));
          fVar163 = auVar86._0_4_;
          fVar141 = auVar86._4_4_;
          fVar142 = auVar86._8_4_;
          fVar157 = auVar86._12_4_;
          local_520._28_4_ = auVar99._28_4_;
          local_520._0_28_ =
               ZEXT1628(CONCAT412(auVar87._12_4_ * fVar157,
                                  CONCAT48(auVar87._8_4_ * fVar142,
                                           CONCAT44(auVar87._4_4_ * fVar141,auVar87._0_4_ * fVar163)
                                          )));
          auVar196 = ZEXT3264(local_520);
          auVar149._4_4_ = local_4a0;
          auVar149._0_4_ = local_4a0;
          auVar149._8_4_ = local_4a0;
          auVar149._12_4_ = local_4a0;
          auVar149._16_4_ = local_4a0;
          auVar149._20_4_ = local_4a0;
          auVar149._24_4_ = local_4a0;
          auVar149._28_4_ = local_4a0;
          uVar158 = vcmpps_avx512vl(local_520,auVar210,2);
          uVar25 = vcmpps_avx512vl(auVar149,local_520,2);
          bVar80 = (byte)uVar158 & (byte)uVar25 & bVar80;
          if (bVar80 != 0) {
            uVar81 = vcmpps_avx512vl(ZEXT1632(auVar85),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar81 = bVar80 & uVar81;
            if ((char)uVar81 != '\0') {
              fVar162 = auVar96._0_4_ * fVar163;
              fVar172 = auVar96._4_4_ * fVar141;
              auVar49._4_4_ = fVar172;
              auVar49._0_4_ = fVar162;
              fVar83 = auVar96._8_4_ * fVar142;
              auVar49._8_4_ = fVar83;
              fVar84 = auVar96._12_4_ * fVar157;
              auVar49._12_4_ = fVar84;
              fVar133 = auVar96._16_4_ * 0.0;
              auVar49._16_4_ = fVar133;
              fVar173 = auVar96._20_4_ * 0.0;
              auVar49._20_4_ = fVar173;
              fVar134 = auVar96._24_4_ * 0.0;
              auVar49._24_4_ = fVar134;
              auVar49._28_4_ = auVar96._28_4_;
              auVar150._8_4_ = 0x3f800000;
              auVar150._0_8_ = 0x3f8000003f800000;
              auVar150._12_4_ = 0x3f800000;
              auVar150._16_4_ = 0x3f800000;
              auVar150._20_4_ = 0x3f800000;
              auVar150._24_4_ = 0x3f800000;
              auVar150._28_4_ = 0x3f800000;
              auVar99 = vsubps_avx(auVar150,auVar49);
              local_2c0._0_4_ =
                   (float)((uint)(bVar71 & 1) * (int)fVar162 |
                          (uint)!(bool)(bVar71 & 1) * auVar99._0_4_);
              bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
              local_2c0._4_4_ = (float)((uint)bVar19 * (int)fVar172 | (uint)!bVar19 * auVar99._4_4_)
              ;
              bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
              local_2c0._8_4_ = (float)((uint)bVar19 * (int)fVar83 | (uint)!bVar19 * auVar99._8_4_);
              bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
              local_2c0._12_4_ =
                   (float)((uint)bVar19 * (int)fVar84 | (uint)!bVar19 * auVar99._12_4_);
              bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
              local_2c0._16_4_ =
                   (float)((uint)bVar19 * (int)fVar133 | (uint)!bVar19 * auVar99._16_4_);
              bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
              local_2c0._20_4_ =
                   (float)((uint)bVar19 * (int)fVar173 | (uint)!bVar19 * auVar99._20_4_);
              bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
              local_2c0._24_4_ =
                   (float)((uint)bVar19 * (int)fVar134 | (uint)!bVar19 * auVar99._24_4_);
              bVar19 = SUB81(uVar72 >> 7,0);
              local_2c0._28_4_ =
                   (float)((uint)bVar19 * auVar96._28_4_ | (uint)!bVar19 * auVar99._28_4_);
              auVar99 = vsubps_avx(ZEXT1632(auVar11),auVar93);
              auVar86 = vfmadd213ps_fma(auVar99,local_2c0,auVar93);
              uVar143 = *(undefined4 *)((long)local_5d8->ray_space + k * 4 + -0x10);
              auVar28._4_4_ = uVar143;
              auVar28._0_4_ = uVar143;
              auVar28._8_4_ = uVar143;
              auVar28._12_4_ = uVar143;
              auVar28._16_4_ = uVar143;
              auVar28._20_4_ = uVar143;
              auVar28._24_4_ = uVar143;
              auVar28._28_4_ = uVar143;
              auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                           CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                                    CONCAT44(auVar86._4_4_ +
                                                                             auVar86._4_4_,
                                                                             auVar86._0_4_ +
                                                                             auVar86._0_4_)))),
                                        auVar28);
              uVar82 = vcmpps_avx512vl(local_520,auVar99,6);
              uVar81 = uVar81 & uVar82;
              bVar80 = (byte)uVar81;
              if (bVar80 != 0) {
                auVar170._0_4_ = auVar97._0_4_ * fVar163;
                auVar170._4_4_ = auVar97._4_4_ * fVar141;
                auVar170._8_4_ = auVar97._8_4_ * fVar142;
                auVar170._12_4_ = auVar97._12_4_ * fVar157;
                auVar170._16_4_ = auVar97._16_4_ * 0.0;
                auVar170._20_4_ = auVar97._20_4_ * 0.0;
                auVar170._24_4_ = auVar97._24_4_ * 0.0;
                auVar170._28_4_ = 0;
                auVar179._8_4_ = 0x3f800000;
                auVar179._0_8_ = 0x3f8000003f800000;
                auVar179._12_4_ = 0x3f800000;
                auVar179._16_4_ = 0x3f800000;
                auVar179._20_4_ = 0x3f800000;
                auVar179._24_4_ = 0x3f800000;
                auVar179._28_4_ = 0x3f800000;
                auVar99 = vsubps_avx(auVar179,auVar170);
                auVar118._0_4_ =
                     (uint)(bVar71 & 1) * (int)auVar170._0_4_ |
                     (uint)!(bool)(bVar71 & 1) * auVar99._0_4_;
                bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
                auVar118._4_4_ = (uint)bVar19 * (int)auVar170._4_4_ | (uint)!bVar19 * auVar99._4_4_;
                bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
                auVar118._8_4_ = (uint)bVar19 * (int)auVar170._8_4_ | (uint)!bVar19 * auVar99._8_4_;
                bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
                auVar118._12_4_ =
                     (uint)bVar19 * (int)auVar170._12_4_ | (uint)!bVar19 * auVar99._12_4_;
                bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
                auVar118._16_4_ =
                     (uint)bVar19 * (int)auVar170._16_4_ | (uint)!bVar19 * auVar99._16_4_;
                bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
                auVar118._20_4_ =
                     (uint)bVar19 * (int)auVar170._20_4_ | (uint)!bVar19 * auVar99._20_4_;
                bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
                auVar118._24_4_ =
                     (uint)bVar19 * (int)auVar170._24_4_ | (uint)!bVar19 * auVar99._24_4_;
                auVar118._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar99._28_4_;
                auVar29._8_4_ = 0x40000000;
                auVar29._0_8_ = 0x4000000040000000;
                auVar29._12_4_ = 0x40000000;
                auVar29._16_4_ = 0x40000000;
                auVar29._20_4_ = 0x40000000;
                auVar29._24_4_ = 0x40000000;
                auVar29._28_4_ = 0x40000000;
                local_2a0 = vfmsub132ps_avx512vl(auVar118,auVar179,auVar29);
                local_280 = local_520;
                local_260 = 0;
                local_25c = iVar14;
                local_250 = local_5a0._0_8_;
                uStack_248 = local_5a0._8_8_;
                local_240 = local_5b0._0_8_;
                uStack_238 = local_5b0._8_8_;
                local_230 = local_5c0._0_8_;
                uStack_228 = local_5c0._8_8_;
                local_220 = local_5d0;
                uStack_218 = uStack_5c8;
                if ((pGVar77->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar163 = 1.0 / auVar200._0_4_;
                  local_200[0] = fVar163 * (local_2c0._0_4_ + 0.0);
                  local_200[1] = fVar163 * (local_2c0._4_4_ + 1.0);
                  local_200[2] = fVar163 * (local_2c0._8_4_ + 2.0);
                  local_200[3] = fVar163 * (local_2c0._12_4_ + 3.0);
                  fStack_1f0 = fVar163 * (local_2c0._16_4_ + 4.0);
                  fStack_1ec = fVar163 * (local_2c0._20_4_ + 5.0);
                  fStack_1e8 = fVar163 * (local_2c0._24_4_ + 6.0);
                  fStack_1e4 = local_2c0._28_4_ + 7.0;
                  local_1e0 = local_2a0;
                  local_1c0 = local_520;
                  auVar151._8_4_ = 0x7f800000;
                  auVar151._0_8_ = 0x7f8000007f800000;
                  auVar151._12_4_ = 0x7f800000;
                  auVar151._16_4_ = 0x7f800000;
                  auVar151._20_4_ = 0x7f800000;
                  auVar151._24_4_ = 0x7f800000;
                  auVar151._28_4_ = 0x7f800000;
                  auVar99 = vblendmps_avx512vl(auVar151,local_520);
                  auVar119._0_4_ =
                       (uint)(bVar80 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar81 >> 1) & 1);
                  auVar119._4_4_ = (uint)bVar19 * auVar99._4_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar81 >> 2) & 1);
                  auVar119._8_4_ = (uint)bVar19 * auVar99._8_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar81 >> 3) & 1);
                  auVar119._12_4_ = (uint)bVar19 * auVar99._12_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar81 >> 4) & 1);
                  auVar119._16_4_ = (uint)bVar19 * auVar99._16_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar81 >> 5) & 1);
                  auVar119._20_4_ = (uint)bVar19 * auVar99._20_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar81 >> 6) & 1);
                  auVar119._24_4_ = (uint)bVar19 * auVar99._24_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = SUB81(uVar81 >> 7,0);
                  auVar119._28_4_ = (uint)bVar19 * auVar99._28_4_ | (uint)!bVar19 * 0x7f800000;
                  auVar99 = vshufps_avx(auVar119,auVar119,0xb1);
                  auVar99 = vminps_avx(auVar119,auVar99);
                  auVar98 = vshufpd_avx(auVar99,auVar99,5);
                  auVar99 = vminps_avx(auVar99,auVar98);
                  auVar98 = vpermpd_avx2(auVar99,0x4e);
                  auVar99 = vminps_avx(auVar99,auVar98);
                  uVar158 = vcmpps_avx512vl(auVar119,auVar99,0);
                  uVar73 = (uint)uVar81;
                  if (((byte)uVar158 & bVar80) != 0) {
                    uVar73 = (uint)((byte)uVar158 & bVar80);
                  }
                  uVar74 = 0;
                  for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                    uVar74 = uVar74 + 1;
                  }
                  uVar72 = (ulong)uVar74;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar86 = vpbroadcastd_avx512vl();
                    local_3e0 = auVar86._0_4_;
                    uStack_3dc = auVar86._4_4_;
                    uStack_3d8 = auVar86._8_4_;
                    uStack_3d4 = auVar86._12_4_;
                    local_540 = vpbroadcastd_avx512vl();
                    do {
                      local_440 = local_200[uVar72];
                      local_430 = *(undefined4 *)(local_1e0 + uVar72 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar72 * 4);
                      local_588.context = context->user;
                      fVar141 = 1.0 - local_440;
                      fVar163 = fVar141 * fVar141 * -3.0;
                      auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141)),
                                                ZEXT416((uint)(local_440 * fVar141)),
                                                ZEXT416(0xc0000000));
                      auVar85 = vfmsub132ss_fma(ZEXT416((uint)(local_440 * fVar141)),
                                                ZEXT416((uint)(local_440 * local_440)),
                                                ZEXT416(0x40000000));
                      fVar141 = auVar86._0_4_ * 3.0;
                      fVar142 = auVar85._0_4_ * 3.0;
                      fVar157 = local_440 * local_440 * 3.0;
                      auVar190._0_4_ = fVar157 * (float)local_5d0._0_4_;
                      auVar190._4_4_ = fVar157 * (float)local_5d0._4_4_;
                      auVar190._8_4_ = fVar157 * (float)uStack_5c8;
                      auVar190._12_4_ = fVar157 * uStack_5c8._4_4_;
                      auVar192 = ZEXT1664(auVar190);
                      auVar146._4_4_ = fVar142;
                      auVar146._0_4_ = fVar142;
                      auVar146._8_4_ = fVar142;
                      auVar146._12_4_ = fVar142;
                      auVar86 = vfmadd132ps_fma(auVar146,auVar190,local_5c0);
                      auVar178._4_4_ = fVar141;
                      auVar178._0_4_ = fVar141;
                      auVar178._8_4_ = fVar141;
                      auVar178._12_4_ = fVar141;
                      auVar86 = vfmadd132ps_fma(auVar178,auVar86,local_5b0);
                      auVar147._4_4_ = fVar163;
                      auVar147._0_4_ = fVar163;
                      auVar147._8_4_ = fVar163;
                      auVar147._12_4_ = fVar163;
                      auVar86 = vfmadd132ps_fma(auVar147,auVar86,local_5a0);
                      local_470 = auVar86._0_4_;
                      local_460 = vshufps_avx(auVar86,auVar86,0x55);
                      auVar186 = ZEXT1664(local_460);
                      local_450 = vshufps_avx(auVar86,auVar86,0xaa);
                      iStack_46c = local_470;
                      iStack_468 = local_470;
                      iStack_464 = local_470;
                      fStack_43c = local_440;
                      fStack_438 = local_440;
                      fStack_434 = local_440;
                      uStack_42c = local_430;
                      uStack_428 = local_430;
                      uStack_424 = local_430;
                      local_420 = local_540._0_8_;
                      uStack_418 = local_540._8_8_;
                      local_410._4_4_ = uStack_3dc;
                      local_410._0_4_ = local_3e0;
                      local_410._8_4_ = uStack_3d8;
                      local_410._12_4_ = uStack_3d4;
                      vpcmpeqd_avx2(ZEXT1632(local_410),ZEXT1632(local_410));
                      uStack_3fc = (local_588.context)->instID[0];
                      local_400 = uStack_3fc;
                      uStack_3f8 = uStack_3fc;
                      uStack_3f4 = uStack_3fc;
                      uStack_3f0 = (local_588.context)->instPrimID[0];
                      uStack_3ec = uStack_3f0;
                      uStack_3e8 = uStack_3f0;
                      uStack_3e4 = uStack_3f0;
                      local_5f0 = local_4d0;
                      local_588.valid = (int *)local_5f0;
                      local_588.geometryUserPtr = pGVar77->userPtr;
                      local_588.hit = (RTCHitN *)&local_470;
                      local_588.N = 4;
                      local_4c0 = auVar213._0_32_;
                      local_588.ray = (RTCRayN *)ray;
                      if (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar186 = ZEXT1664(local_460);
                        auVar192 = ZEXT1664(auVar190);
                        (*pGVar77->intersectionFilterN)(&local_588);
                        auVar196 = ZEXT3264(local_520);
                        auVar213 = ZEXT3264(local_4c0);
                        auVar215 = ZEXT464(0xbf800000);
                        auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar214 = ZEXT3264(auVar99);
                        auVar99 = vbroadcastss_avx512vl(ZEXT416(1));
                        auVar216 = ZEXT3264(auVar99);
                      }
                      uVar82 = vptestmd_avx512vl(local_5f0,local_5f0);
                      if ((uVar82 & 0xf) == 0) {
LAB_01dd63be:
                        *(int *)(ray + k * 4 + 0x80) = auVar213._0_4_;
                      }
                      else {
                        p_Var18 = context->args->filter;
                        if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar77->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar186 = ZEXT1664(auVar186._0_16_);
                          auVar192 = ZEXT1664(auVar192._0_16_);
                          (*p_Var18)(&local_588);
                          auVar196 = ZEXT3264(local_520);
                          auVar213 = ZEXT3264(local_4c0);
                          auVar215 = ZEXT464(0xbf800000);
                          auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar214 = ZEXT3264(auVar99);
                          auVar99 = vbroadcastss_avx512vl(ZEXT416(1));
                          auVar216 = ZEXT3264(auVar99);
                        }
                        uVar82 = vptestmd_avx512vl(local_5f0,local_5f0);
                        uVar82 = uVar82 & 0xf;
                        bVar80 = (byte)uVar82;
                        if (bVar80 == 0) goto LAB_01dd63be;
                        iVar1 = *(int *)(local_588.hit + 4);
                        iVar2 = *(int *)(local_588.hit + 8);
                        iVar67 = *(int *)(local_588.hit + 0xc);
                        bVar19 = (bool)((byte)(uVar82 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar82 >> 2) & 1);
                        bVar21 = SUB81(uVar82 >> 3,0);
                        *(uint *)(local_588.ray + 0xc0) =
                             (uint)(bVar80 & 1) * *(int *)local_588.hit |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_588.ray + 0xc0);
                        *(uint *)(local_588.ray + 0xc4) =
                             (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_588.ray + 0xc4);
                        *(uint *)(local_588.ray + 200) =
                             (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_588.ray + 200);
                        *(uint *)(local_588.ray + 0xcc) =
                             (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_588.ray + 0xcc);
                        iVar1 = *(int *)(local_588.hit + 0x14);
                        iVar2 = *(int *)(local_588.hit + 0x18);
                        iVar67 = *(int *)(local_588.hit + 0x1c);
                        bVar19 = (bool)((byte)(uVar82 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar82 >> 2) & 1);
                        bVar21 = SUB81(uVar82 >> 3,0);
                        *(uint *)(local_588.ray + 0xd0) =
                             (uint)(bVar80 & 1) * *(int *)(local_588.hit + 0x10) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_588.ray + 0xd0);
                        *(uint *)(local_588.ray + 0xd4) =
                             (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_588.ray + 0xd4);
                        *(uint *)(local_588.ray + 0xd8) =
                             (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_588.ray + 0xd8);
                        *(uint *)(local_588.ray + 0xdc) =
                             (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_588.ray + 0xdc);
                        iVar1 = *(int *)(local_588.hit + 0x24);
                        iVar2 = *(int *)(local_588.hit + 0x28);
                        iVar67 = *(int *)(local_588.hit + 0x2c);
                        bVar19 = (bool)((byte)(uVar82 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar82 >> 2) & 1);
                        bVar21 = SUB81(uVar82 >> 3,0);
                        *(uint *)(local_588.ray + 0xe0) =
                             (uint)(bVar80 & 1) * *(int *)(local_588.hit + 0x20) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_588.ray + 0xe0);
                        *(uint *)(local_588.ray + 0xe4) =
                             (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_588.ray + 0xe4);
                        *(uint *)(local_588.ray + 0xe8) =
                             (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_588.ray + 0xe8);
                        *(uint *)(local_588.ray + 0xec) =
                             (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_588.ray + 0xec);
                        iVar1 = *(int *)(local_588.hit + 0x34);
                        iVar2 = *(int *)(local_588.hit + 0x38);
                        iVar67 = *(int *)(local_588.hit + 0x3c);
                        bVar19 = (bool)((byte)(uVar82 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar82 >> 2) & 1);
                        bVar21 = SUB81(uVar82 >> 3,0);
                        *(uint *)(local_588.ray + 0xf0) =
                             (uint)(bVar80 & 1) * *(int *)(local_588.hit + 0x30) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_588.ray + 0xf0);
                        *(uint *)(local_588.ray + 0xf4) =
                             (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_588.ray + 0xf4);
                        *(uint *)(local_588.ray + 0xf8) =
                             (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_588.ray + 0xf8);
                        *(uint *)(local_588.ray + 0xfc) =
                             (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_588.ray + 0xfc);
                        iVar1 = *(int *)(local_588.hit + 0x44);
                        iVar2 = *(int *)(local_588.hit + 0x48);
                        iVar67 = *(int *)(local_588.hit + 0x4c);
                        bVar19 = (bool)((byte)(uVar82 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar82 >> 2) & 1);
                        bVar21 = SUB81(uVar82 >> 3,0);
                        *(uint *)(local_588.ray + 0x100) =
                             (uint)(bVar80 & 1) * *(int *)(local_588.hit + 0x40) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_588.ray + 0x100);
                        *(uint *)(local_588.ray + 0x104) =
                             (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_588.ray + 0x104);
                        *(uint *)(local_588.ray + 0x108) =
                             (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_588.ray + 0x108);
                        *(uint *)(local_588.ray + 0x10c) =
                             (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_588.ray + 0x10c)
                        ;
                        auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x50));
                        *(undefined1 (*) [16])(local_588.ray + 0x110) = auVar86;
                        auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x60));
                        *(undefined1 (*) [16])(local_588.ray + 0x120) = auVar86;
                        auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x70));
                        *(undefined1 (*) [16])(local_588.ray + 0x130) = auVar86;
                        auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x80));
                        *(undefined1 (*) [16])(local_588.ray + 0x140) = auVar86;
                        auVar213 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                      }
                      bVar80 = ~(byte)(1 << ((uint)uVar72 & 0x1f)) & (byte)uVar81;
                      uVar143 = auVar213._0_4_;
                      auVar155._4_4_ = uVar143;
                      auVar155._0_4_ = uVar143;
                      auVar155._8_4_ = uVar143;
                      auVar155._12_4_ = uVar143;
                      auVar155._16_4_ = uVar143;
                      auVar155._20_4_ = uVar143;
                      auVar155._24_4_ = uVar143;
                      auVar155._28_4_ = uVar143;
                      uVar158 = vcmpps_avx512vl(auVar196._0_32_,auVar155,2);
                      if ((bVar80 & (byte)uVar158) == 0) goto LAB_01dd5368;
                      bVar80 = bVar80 & (byte)uVar158;
                      uVar81 = (ulong)bVar80;
                      auVar156._8_4_ = 0x7f800000;
                      auVar156._0_8_ = 0x7f8000007f800000;
                      auVar156._12_4_ = 0x7f800000;
                      auVar156._16_4_ = 0x7f800000;
                      auVar156._20_4_ = 0x7f800000;
                      auVar156._24_4_ = 0x7f800000;
                      auVar156._28_4_ = 0x7f800000;
                      auVar99 = vblendmps_avx512vl(auVar156,auVar196._0_32_);
                      auVar132._0_4_ =
                           (uint)(bVar80 & 1) * auVar99._0_4_ |
                           (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                      bVar19 = (bool)(bVar80 >> 1 & 1);
                      auVar132._4_4_ = (uint)bVar19 * auVar99._4_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar80 >> 2 & 1);
                      auVar132._8_4_ = (uint)bVar19 * auVar99._8_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar80 >> 3 & 1);
                      auVar132._12_4_ = (uint)bVar19 * auVar99._12_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar80 >> 4 & 1);
                      auVar132._16_4_ = (uint)bVar19 * auVar99._16_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar80 >> 5 & 1);
                      auVar132._20_4_ = (uint)bVar19 * auVar99._20_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar80 >> 6 & 1);
                      auVar132._24_4_ = (uint)bVar19 * auVar99._24_4_ | (uint)!bVar19 * 0x7f800000;
                      auVar132._28_4_ =
                           (uint)(bVar80 >> 7) * auVar99._28_4_ |
                           (uint)!(bool)(bVar80 >> 7) * 0x7f800000;
                      auVar99 = vshufps_avx(auVar132,auVar132,0xb1);
                      auVar99 = vminps_avx(auVar132,auVar99);
                      auVar98 = vshufpd_avx(auVar99,auVar99,5);
                      auVar99 = vminps_avx(auVar99,auVar98);
                      auVar98 = vpermpd_avx2(auVar99,0x4e);
                      auVar99 = vminps_avx(auVar99,auVar98);
                      uVar158 = vcmpps_avx512vl(auVar132,auVar99,0);
                      bVar71 = (byte)uVar158 & bVar80;
                      if (bVar71 != 0) {
                        bVar80 = bVar71;
                      }
                      uVar73 = 0;
                      for (uVar74 = (uint)bVar80; (uVar74 & 1) == 0;
                          uVar74 = uVar74 >> 1 | 0x80000000) {
                        uVar73 = uVar73 + 1;
                      }
                      uVar72 = (ulong)uVar73;
                    } while( true );
                  }
                  fVar163 = local_200[uVar72];
                  uVar143 = *(undefined4 *)(local_1e0 + uVar72 * 4);
                  fVar142 = 1.0 - fVar163;
                  fVar141 = fVar142 * fVar142 * -3.0;
                  auVar186 = ZEXT464((uint)fVar141);
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),
                                            ZEXT416((uint)(fVar163 * fVar142)),ZEXT416(0xc0000000));
                  auVar85 = vfmsub132ss_fma(ZEXT416((uint)(fVar163 * fVar142)),
                                            ZEXT416((uint)(fVar163 * fVar163)),ZEXT416(0x40000000));
                  fVar142 = auVar86._0_4_ * 3.0;
                  fVar157 = auVar85._0_4_ * 3.0;
                  fVar162 = fVar163 * fVar163 * 3.0;
                  auVar187._0_4_ = fVar162 * (float)local_5d0._0_4_;
                  auVar187._4_4_ = fVar162 * (float)local_5d0._4_4_;
                  auVar187._8_4_ = fVar162 * (float)uStack_5c8;
                  auVar187._12_4_ = fVar162 * uStack_5c8._4_4_;
                  auVar192 = ZEXT1664(auVar187);
                  auVar165._4_4_ = fVar157;
                  auVar165._0_4_ = fVar157;
                  auVar165._8_4_ = fVar157;
                  auVar165._12_4_ = fVar157;
                  auVar86 = vfmadd132ps_fma(auVar165,auVar187,local_5c0);
                  auVar175._4_4_ = fVar142;
                  auVar175._0_4_ = fVar142;
                  auVar175._8_4_ = fVar142;
                  auVar175._12_4_ = fVar142;
                  auVar86 = vfmadd132ps_fma(auVar175,auVar86,local_5b0);
                  auVar166._4_4_ = fVar141;
                  auVar166._0_4_ = fVar141;
                  auVar166._8_4_ = fVar141;
                  auVar166._12_4_ = fVar141;
                  auVar86 = vfmadd132ps_fma(auVar166,auVar86,local_5a0);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar72 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar86._0_4_;
                  uVar15 = vextractps_avx(auVar86,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar15;
                  uVar15 = vextractps_avx(auVar86,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar15;
                  *(float *)(ray + k * 4 + 0xf0) = fVar163;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar143;
                  *(uint *)(ray + k * 4 + 0x110) = uVar13;
                  *(uint *)(ray + k * 4 + 0x120) = uVar78;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01dd5368:
      if (8 < iVar14) {
        local_4c0 = vpbroadcastd_avx512vl();
        local_3e0 = local_500._0_4_;
        uStack_3dc = local_500._0_4_;
        uStack_3d8 = local_500._0_4_;
        uStack_3d4 = local_500._0_4_;
        uStack_3d0 = local_500._0_4_;
        uStack_3cc = local_500._0_4_;
        uStack_3c8 = local_500._0_4_;
        uStack_3c4 = local_500._0_4_;
        uStack_49c = local_4a0;
        uStack_498 = local_4a0;
        uStack_494 = local_4a0;
        uStack_490 = local_4a0;
        uStack_48c = local_4a0;
        uStack_488 = local_4a0;
        uStack_484 = local_4a0;
        local_120 = 1.0 / (float)local_550._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_550 = vpbroadcastd_avx512vl();
        local_540 = vpbroadcastd_avx512vl();
        lVar75 = 8;
LAB_01dd5427:
        auVar99 = vpbroadcastd_avx512vl();
        auVar99 = vpor_avx2(auVar99,_DAT_01fe9900);
        uVar25 = vpcmpd_avx512vl(auVar99,local_4c0,1);
        auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar75 * 4 + lVar26);
        auVar98 = *(undefined1 (*) [32])(lVar26 + 0x21aa768 + lVar75 * 4);
        auVar107 = *(undefined1 (*) [32])(lVar26 + 0x21aabec + lVar75 * 4);
        auVar106 = *(undefined1 (*) [32])(lVar26 + 0x21ab070 + lVar75 * 4);
        auVar213._0_4_ = auVar106._0_4_ * (float)local_3a0._0_4_;
        auVar213._4_4_ = auVar106._4_4_ * (float)local_3a0._4_4_;
        auVar213._8_4_ = auVar106._8_4_ * fStack_398;
        auVar213._12_4_ = auVar106._12_4_ * fStack_394;
        auVar213._16_4_ = auVar106._16_4_ * fStack_390;
        auVar213._20_4_ = auVar106._20_4_ * fStack_38c;
        auVar213._28_36_ = auVar192._28_36_;
        auVar213._24_4_ = auVar106._24_4_ * fStack_388;
        auVar192._0_4_ = auVar106._0_4_ * (float)local_3c0._0_4_;
        auVar192._4_4_ = auVar106._4_4_ * (float)local_3c0._4_4_;
        auVar192._8_4_ = auVar106._8_4_ * fStack_3b8;
        auVar192._12_4_ = auVar106._12_4_ * fStack_3b4;
        auVar192._16_4_ = auVar106._16_4_ * fStack_3b0;
        auVar192._20_4_ = auVar106._20_4_ * fStack_3ac;
        auVar192._28_36_ = auVar186._28_36_;
        auVar192._24_4_ = auVar106._24_4_ * fStack_3a8;
        auVar100 = vmulps_avx512vl(local_100,auVar106);
        auVar101 = vfmadd231ps_avx512vl(auVar213._0_32_,auVar107,local_360);
        auVar105 = vfmadd231ps_avx512vl(auVar192._0_32_,auVar107,local_380);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,local_e0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,local_320);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar98,local_340);
        auVar102 = vfmadd231ps_avx512vl(auVar100,auVar98,local_c0);
        auVar86 = vfmadd231ps_fma(auVar101,auVar99,local_2e0);
        auVar192 = ZEXT1664(auVar86);
        auVar85 = vfmadd231ps_fma(auVar105,auVar99,local_300);
        auVar186 = ZEXT1664(auVar85);
        auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar75 * 4 + lVar26);
        auVar101 = *(undefined1 (*) [32])(lVar26 + 0x21acb88 + lVar75 * 4);
        auVar97 = vfmadd231ps_avx512vl(auVar102,auVar99,local_a0);
        auVar105 = *(undefined1 (*) [32])(lVar26 + 0x21ad00c + lVar75 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar26 + 0x21ad490 + lVar75 * 4);
        auVar197._0_4_ = auVar102._0_4_ * (float)local_3a0._0_4_;
        auVar197._4_4_ = auVar102._4_4_ * (float)local_3a0._4_4_;
        auVar197._8_4_ = auVar102._8_4_ * fStack_398;
        auVar197._12_4_ = auVar102._12_4_ * fStack_394;
        auVar197._16_4_ = auVar102._16_4_ * fStack_390;
        auVar197._20_4_ = auVar102._20_4_ * fStack_38c;
        auVar197._28_36_ = auVar196._28_36_;
        auVar197._24_4_ = auVar102._24_4_ * fStack_388;
        auVar50._4_4_ = auVar102._4_4_ * (float)local_3c0._4_4_;
        auVar50._0_4_ = auVar102._0_4_ * (float)local_3c0._0_4_;
        auVar50._8_4_ = auVar102._8_4_ * fStack_3b8;
        auVar50._12_4_ = auVar102._12_4_ * fStack_3b4;
        auVar50._16_4_ = auVar102._16_4_ * fStack_3b0;
        auVar50._20_4_ = auVar102._20_4_ * fStack_3ac;
        auVar50._24_4_ = auVar102._24_4_ * fStack_3a8;
        auVar50._28_4_ = uStack_3a4;
        auVar103 = vmulps_avx512vl(local_100,auVar102);
        auVar96 = vfmadd231ps_avx512vl(auVar197._0_32_,auVar105,local_360);
        auVar104 = vfmadd231ps_avx512vl(auVar50,auVar105,local_380);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,local_e0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar101,local_320);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,local_340);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar101,local_c0);
        auVar87 = vfmadd231ps_fma(auVar96,auVar100,local_2e0);
        auVar196 = ZEXT1664(auVar87);
        auVar6 = vfmadd231ps_fma(auVar104,auVar100,local_300);
        auVar104 = vfmadd231ps_avx512vl(auVar103,auVar100,local_a0);
        auVar92 = vmaxps_avx512vl(auVar97,auVar104);
        auVar103 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar86));
        auVar96 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar85));
        auVar93 = vmulps_avx512vl(ZEXT1632(auVar85),auVar103);
        auVar94 = vmulps_avx512vl(ZEXT1632(auVar86),auVar96);
        auVar93 = vsubps_avx512vl(auVar93,auVar94);
        auVar94 = vmulps_avx512vl(auVar96,auVar96);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar103,auVar103);
        auVar92 = vmulps_avx512vl(auVar92,auVar92);
        auVar92 = vmulps_avx512vl(auVar92,auVar94);
        auVar93 = vmulps_avx512vl(auVar93,auVar93);
        uVar158 = vcmpps_avx512vl(auVar93,auVar92,2);
        bVar80 = (byte)uVar25 & (byte)uVar158;
        if (bVar80 != 0) {
          auVar102 = vmulps_avx512vl(local_1a0,auVar102);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_180,auVar102);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_160,auVar105);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar101);
          auVar106 = vmulps_avx512vl(local_1a0,auVar106);
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar106);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_160,auVar107);
          auVar101 = vfmadd213ps_avx512vl(auVar99,local_140,auVar98);
          auVar99 = *(undefined1 (*) [32])(lVar26 + 0x21ab4f4 + lVar75 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar26 + 0x21ab978 + lVar75 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar26 + 0x21abdfc + lVar75 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar26 + 0x21ac280 + lVar75 * 4);
          auVar105 = vmulps_avx512vl(_local_3a0,auVar106);
          auVar102 = vmulps_avx512vl(_local_3c0,auVar106);
          auVar106 = vmulps_avx512vl(local_1a0,auVar106);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_360);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,local_380);
          auVar107 = vfmadd231ps_avx512vl(auVar106,local_180,auVar107);
          auVar106 = vfmadd231ps_avx512vl(auVar105,auVar98,local_320);
          auVar105 = vfmadd231ps_avx512vl(auVar102,auVar98,local_340);
          auVar98 = vfmadd231ps_avx512vl(auVar107,local_160,auVar98);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar99,local_2e0);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar99,local_300);
          auVar102 = vfmadd231ps_avx512vl(auVar98,local_140,auVar99);
          auVar99 = *(undefined1 (*) [32])(lVar26 + 0x21ad914 + lVar75 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar26 + 0x21ae21c + lVar75 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar26 + 0x21ae6a0 + lVar75 * 4);
          auVar92 = vmulps_avx512vl(_local_3a0,auVar107);
          auVar93 = vmulps_avx512vl(_local_3c0,auVar107);
          auVar107 = vmulps_avx512vl(local_1a0,auVar107);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar98,local_360);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,local_380);
          auVar107 = vfmadd231ps_avx512vl(auVar107,local_180,auVar98);
          auVar98 = *(undefined1 (*) [32])(lVar26 + 0x21add98 + lVar75 * 4);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar98,local_320);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,local_340);
          auVar98 = vfmadd231ps_avx512vl(auVar107,local_160,auVar98);
          auVar107 = vfmadd231ps_avx512vl(auVar92,auVar99,local_2e0);
          auVar92 = vfmadd231ps_avx512vl(auVar93,auVar99,local_300);
          auVar98 = vfmadd231ps_avx512vl(auVar98,local_140,auVar99);
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar106,auVar93);
          vandps_avx512vl(auVar105,auVar93);
          auVar99 = vmaxps_avx(auVar93,auVar93);
          vandps_avx512vl(auVar102,auVar93);
          auVar99 = vmaxps_avx(auVar99,auVar93);
          auVar69._4_4_ = uStack_3dc;
          auVar69._0_4_ = local_3e0;
          auVar69._8_4_ = uStack_3d8;
          auVar69._12_4_ = uStack_3d4;
          auVar69._16_4_ = uStack_3d0;
          auVar69._20_4_ = uStack_3cc;
          auVar69._24_4_ = uStack_3c8;
          auVar69._28_4_ = uStack_3c4;
          uVar72 = vcmpps_avx512vl(auVar99,auVar69,1);
          bVar19 = (bool)((byte)uVar72 & 1);
          auVar120._0_4_ = (float)((uint)bVar19 * auVar103._0_4_ | (uint)!bVar19 * auVar106._0_4_);
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar19 * auVar103._4_4_ | (uint)!bVar19 * auVar106._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar19 * auVar103._8_4_ | (uint)!bVar19 * auVar106._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar120._12_4_ =
               (float)((uint)bVar19 * auVar103._12_4_ | (uint)!bVar19 * auVar106._12_4_);
          bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar120._16_4_ =
               (float)((uint)bVar19 * auVar103._16_4_ | (uint)!bVar19 * auVar106._16_4_);
          bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar120._20_4_ =
               (float)((uint)bVar19 * auVar103._20_4_ | (uint)!bVar19 * auVar106._20_4_);
          bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar120._24_4_ =
               (float)((uint)bVar19 * auVar103._24_4_ | (uint)!bVar19 * auVar106._24_4_);
          bVar19 = SUB81(uVar72 >> 7,0);
          auVar120._28_4_ = (uint)bVar19 * auVar103._28_4_ | (uint)!bVar19 * auVar106._28_4_;
          bVar19 = (bool)((byte)uVar72 & 1);
          auVar121._0_4_ = (float)((uint)bVar19 * auVar96._0_4_ | (uint)!bVar19 * auVar105._0_4_);
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar19 * auVar96._4_4_ | (uint)!bVar19 * auVar105._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar19 * auVar96._8_4_ | (uint)!bVar19 * auVar105._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar19 * auVar96._12_4_ | (uint)!bVar19 * auVar105._12_4_)
          ;
          bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar121._16_4_ = (float)((uint)bVar19 * auVar96._16_4_ | (uint)!bVar19 * auVar105._16_4_)
          ;
          bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar121._20_4_ = (float)((uint)bVar19 * auVar96._20_4_ | (uint)!bVar19 * auVar105._20_4_)
          ;
          bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar121._24_4_ = (float)((uint)bVar19 * auVar96._24_4_ | (uint)!bVar19 * auVar105._24_4_)
          ;
          bVar19 = SUB81(uVar72 >> 7,0);
          auVar121._28_4_ = (uint)bVar19 * auVar96._28_4_ | (uint)!bVar19 * auVar105._28_4_;
          vandps_avx512vl(auVar107,auVar93);
          vandps_avx512vl(auVar92,auVar93);
          auVar99 = vmaxps_avx(auVar121,auVar121);
          vandps_avx512vl(auVar98,auVar93);
          auVar99 = vmaxps_avx(auVar99,auVar121);
          uVar72 = vcmpps_avx512vl(auVar99,auVar69,1);
          bVar19 = (bool)((byte)uVar72 & 1);
          auVar122._0_4_ = (uint)bVar19 * auVar103._0_4_ | (uint)!bVar19 * auVar107._0_4_;
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar19 * auVar103._4_4_ | (uint)!bVar19 * auVar107._4_4_;
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar19 * auVar103._8_4_ | (uint)!bVar19 * auVar107._8_4_;
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar19 * auVar103._12_4_ | (uint)!bVar19 * auVar107._12_4_;
          bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar122._16_4_ = (uint)bVar19 * auVar103._16_4_ | (uint)!bVar19 * auVar107._16_4_;
          bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar122._20_4_ = (uint)bVar19 * auVar103._20_4_ | (uint)!bVar19 * auVar107._20_4_;
          bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar122._24_4_ = (uint)bVar19 * auVar103._24_4_ | (uint)!bVar19 * auVar107._24_4_;
          bVar19 = SUB81(uVar72 >> 7,0);
          auVar122._28_4_ = (uint)bVar19 * auVar103._28_4_ | (uint)!bVar19 * auVar107._28_4_;
          bVar19 = (bool)((byte)uVar72 & 1);
          auVar123._0_4_ = (float)((uint)bVar19 * auVar96._0_4_ | (uint)!bVar19 * auVar92._0_4_);
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar19 * auVar96._4_4_ | (uint)!bVar19 * auVar92._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar19 * auVar96._8_4_ | (uint)!bVar19 * auVar92._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar19 * auVar96._12_4_ | (uint)!bVar19 * auVar92._12_4_);
          bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar123._16_4_ = (float)((uint)bVar19 * auVar96._16_4_ | (uint)!bVar19 * auVar92._16_4_);
          bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar123._20_4_ = (float)((uint)bVar19 * auVar96._20_4_ | (uint)!bVar19 * auVar92._20_4_);
          bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar123._24_4_ = (float)((uint)bVar19 * auVar96._24_4_ | (uint)!bVar19 * auVar92._24_4_);
          bVar19 = SUB81(uVar72 >> 7,0);
          auVar123._28_4_ = (uint)bVar19 * auVar96._28_4_ | (uint)!bVar19 * auVar92._28_4_;
          auVar203._8_4_ = 0x80000000;
          auVar203._0_8_ = 0x8000000080000000;
          auVar203._12_4_ = 0x80000000;
          auVar203._16_4_ = 0x80000000;
          auVar203._20_4_ = 0x80000000;
          auVar203._24_4_ = 0x80000000;
          auVar203._28_4_ = 0x80000000;
          auVar99 = vxorps_avx512vl(auVar122,auVar203);
          auVar91 = vxorps_avx512vl(auVar93._0_16_,auVar93._0_16_);
          auVar98 = vfmadd213ps_avx512vl(auVar120,auVar120,ZEXT1632(auVar91));
          auVar7 = vfmadd231ps_fma(auVar98,auVar121,auVar121);
          auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar7));
          auVar211._8_4_ = 0xbf000000;
          auVar211._0_8_ = 0xbf000000bf000000;
          auVar211._12_4_ = 0xbf000000;
          auVar211._16_4_ = 0xbf000000;
          auVar211._20_4_ = 0xbf000000;
          auVar211._24_4_ = 0xbf000000;
          auVar211._28_4_ = 0xbf000000;
          fVar163 = auVar98._0_4_;
          fVar141 = auVar98._4_4_;
          fVar142 = auVar98._8_4_;
          fVar157 = auVar98._12_4_;
          fVar162 = auVar98._16_4_;
          fVar172 = auVar98._20_4_;
          fVar83 = auVar98._24_4_;
          auVar51._4_4_ = fVar141 * fVar141 * fVar141 * auVar7._4_4_ * -0.5;
          auVar51._0_4_ = fVar163 * fVar163 * fVar163 * auVar7._0_4_ * -0.5;
          auVar51._8_4_ = fVar142 * fVar142 * fVar142 * auVar7._8_4_ * -0.5;
          auVar51._12_4_ = fVar157 * fVar157 * fVar157 * auVar7._12_4_ * -0.5;
          auVar51._16_4_ = fVar162 * fVar162 * fVar162 * -0.0;
          auVar51._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar51._24_4_ = fVar83 * fVar83 * fVar83 * -0.0;
          auVar51._28_4_ = auVar121._28_4_;
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar98 = vfmadd231ps_avx512vl(auVar51,auVar107,auVar98);
          auVar52._4_4_ = auVar121._4_4_ * auVar98._4_4_;
          auVar52._0_4_ = auVar121._0_4_ * auVar98._0_4_;
          auVar52._8_4_ = auVar121._8_4_ * auVar98._8_4_;
          auVar52._12_4_ = auVar121._12_4_ * auVar98._12_4_;
          auVar52._16_4_ = auVar121._16_4_ * auVar98._16_4_;
          auVar52._20_4_ = auVar121._20_4_ * auVar98._20_4_;
          auVar52._24_4_ = auVar121._24_4_ * auVar98._24_4_;
          auVar52._28_4_ = 0;
          auVar53._4_4_ = auVar98._4_4_ * -auVar120._4_4_;
          auVar53._0_4_ = auVar98._0_4_ * -auVar120._0_4_;
          auVar53._8_4_ = auVar98._8_4_ * -auVar120._8_4_;
          auVar53._12_4_ = auVar98._12_4_ * -auVar120._12_4_;
          auVar53._16_4_ = auVar98._16_4_ * -auVar120._16_4_;
          auVar53._20_4_ = auVar98._20_4_ * -auVar120._20_4_;
          auVar53._24_4_ = auVar98._24_4_ * -auVar120._24_4_;
          auVar53._28_4_ = auVar121._28_4_;
          auVar106 = vmulps_avx512vl(auVar98,ZEXT1632(auVar91));
          auVar102 = ZEXT1632(auVar91);
          auVar98 = vfmadd213ps_avx512vl(auVar122,auVar122,auVar102);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar123,auVar123);
          auVar105 = vrsqrt14ps_avx512vl(auVar98);
          auVar98 = vmulps_avx512vl(auVar98,auVar211);
          fVar163 = auVar105._0_4_;
          fVar141 = auVar105._4_4_;
          fVar142 = auVar105._8_4_;
          fVar157 = auVar105._12_4_;
          fVar162 = auVar105._16_4_;
          fVar172 = auVar105._20_4_;
          fVar83 = auVar105._24_4_;
          auVar54._4_4_ = fVar141 * fVar141 * fVar141 * auVar98._4_4_;
          auVar54._0_4_ = fVar163 * fVar163 * fVar163 * auVar98._0_4_;
          auVar54._8_4_ = fVar142 * fVar142 * fVar142 * auVar98._8_4_;
          auVar54._12_4_ = fVar157 * fVar157 * fVar157 * auVar98._12_4_;
          auVar54._16_4_ = fVar162 * fVar162 * fVar162 * auVar98._16_4_;
          auVar54._20_4_ = fVar172 * fVar172 * fVar172 * auVar98._20_4_;
          auVar54._24_4_ = fVar83 * fVar83 * fVar83 * auVar98._24_4_;
          auVar54._28_4_ = auVar98._28_4_;
          auVar98 = vfmadd231ps_avx512vl(auVar54,auVar107,auVar105);
          auVar55._4_4_ = auVar123._4_4_ * auVar98._4_4_;
          auVar55._0_4_ = auVar123._0_4_ * auVar98._0_4_;
          auVar55._8_4_ = auVar123._8_4_ * auVar98._8_4_;
          auVar55._12_4_ = auVar123._12_4_ * auVar98._12_4_;
          auVar55._16_4_ = auVar123._16_4_ * auVar98._16_4_;
          auVar55._20_4_ = auVar123._20_4_ * auVar98._20_4_;
          auVar55._24_4_ = auVar123._24_4_ * auVar98._24_4_;
          auVar55._28_4_ = auVar105._28_4_;
          auVar56._4_4_ = auVar98._4_4_ * auVar99._4_4_;
          auVar56._0_4_ = auVar98._0_4_ * auVar99._0_4_;
          auVar56._8_4_ = auVar98._8_4_ * auVar99._8_4_;
          auVar56._12_4_ = auVar98._12_4_ * auVar99._12_4_;
          auVar56._16_4_ = auVar98._16_4_ * auVar99._16_4_;
          auVar56._20_4_ = auVar98._20_4_ * auVar99._20_4_;
          auVar56._24_4_ = auVar98._24_4_ * auVar99._24_4_;
          auVar56._28_4_ = auVar99._28_4_;
          auVar99 = vmulps_avx512vl(auVar98,auVar102);
          auVar7 = vfmadd213ps_fma(auVar52,auVar97,ZEXT1632(auVar86));
          auVar8 = vfmadd213ps_fma(auVar53,auVar97,ZEXT1632(auVar85));
          auVar107 = vfmadd213ps_avx512vl(auVar106,auVar97,auVar101);
          auVar105 = vfmadd213ps_avx512vl(auVar55,auVar104,ZEXT1632(auVar87));
          auVar10 = vfnmadd213ps_fma(auVar52,auVar97,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(auVar56,auVar104,ZEXT1632(auVar6));
          auVar11 = vfnmadd213ps_fma(auVar53,auVar97,ZEXT1632(auVar85));
          auVar85 = vfmadd213ps_fma(auVar99,auVar104,auVar100);
          auVar159 = vfnmadd231ps_fma(auVar101,auVar97,auVar106);
          auVar88 = vfnmadd213ps_fma(auVar55,auVar104,ZEXT1632(auVar87));
          auVar89 = vfnmadd213ps_fma(auVar56,auVar104,ZEXT1632(auVar6));
          auVar90 = vfnmadd231ps_fma(auVar100,auVar104,auVar99);
          auVar100 = vsubps_avx512vl(auVar105,ZEXT1632(auVar10));
          auVar99 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar11));
          auVar98 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar159));
          auVar57._4_4_ = auVar99._4_4_ * auVar159._4_4_;
          auVar57._0_4_ = auVar99._0_4_ * auVar159._0_4_;
          auVar57._8_4_ = auVar99._8_4_ * auVar159._8_4_;
          auVar57._12_4_ = auVar99._12_4_ * auVar159._12_4_;
          auVar57._16_4_ = auVar99._16_4_ * 0.0;
          auVar57._20_4_ = auVar99._20_4_ * 0.0;
          auVar57._24_4_ = auVar99._24_4_ * 0.0;
          auVar57._28_4_ = auVar106._28_4_;
          auVar87 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar11),auVar98);
          auVar58._4_4_ = auVar98._4_4_ * auVar10._4_4_;
          auVar58._0_4_ = auVar98._0_4_ * auVar10._0_4_;
          auVar58._8_4_ = auVar98._8_4_ * auVar10._8_4_;
          auVar58._12_4_ = auVar98._12_4_ * auVar10._12_4_;
          auVar58._16_4_ = auVar98._16_4_ * 0.0;
          auVar58._20_4_ = auVar98._20_4_ * 0.0;
          auVar58._24_4_ = auVar98._24_4_ * 0.0;
          auVar58._28_4_ = auVar98._28_4_;
          auVar6 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar159),auVar100);
          auVar59._4_4_ = auVar11._4_4_ * auVar100._4_4_;
          auVar59._0_4_ = auVar11._0_4_ * auVar100._0_4_;
          auVar59._8_4_ = auVar11._8_4_ * auVar100._8_4_;
          auVar59._12_4_ = auVar11._12_4_ * auVar100._12_4_;
          auVar59._16_4_ = auVar100._16_4_ * 0.0;
          auVar59._20_4_ = auVar100._20_4_ * 0.0;
          auVar59._24_4_ = auVar100._24_4_ * 0.0;
          auVar59._28_4_ = auVar100._28_4_;
          auVar9 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar10),auVar99);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar102,ZEXT1632(auVar6));
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,ZEXT1632(auVar87));
          auVar93 = ZEXT1632(auVar91);
          uVar72 = vcmpps_avx512vl(auVar99,auVar93,2);
          bVar71 = (byte)uVar72;
          fVar173 = (float)((uint)(bVar71 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar71 & 1) * auVar88._0_4_);
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          fVar135 = (float)((uint)bVar19 * auVar7._4_4_ | (uint)!bVar19 * auVar88._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          fVar138 = (float)((uint)bVar19 * auVar7._8_4_ | (uint)!bVar19 * auVar88._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          fVar139 = (float)((uint)bVar19 * auVar7._12_4_ | (uint)!bVar19 * auVar88._12_4_);
          auVar102 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar138,CONCAT44(fVar135,fVar173))));
          fVar134 = (float)((uint)(bVar71 & 1) * auVar8._0_4_ |
                           (uint)!(bool)(bVar71 & 1) * auVar89._0_4_);
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          fVar137 = (float)((uint)bVar19 * auVar8._4_4_ | (uint)!bVar19 * auVar89._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          fVar136 = (float)((uint)bVar19 * auVar8._8_4_ | (uint)!bVar19 * auVar89._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          fVar140 = (float)((uint)bVar19 * auVar8._12_4_ | (uint)!bVar19 * auVar89._12_4_);
          auVar103 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar136,CONCAT44(fVar137,fVar134))));
          auVar124._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar107._0_4_ |
                      (uint)!(bool)(bVar71 & 1) * auVar90._0_4_);
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar19 * auVar107._4_4_ | (uint)!bVar19 * auVar90._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar19 * auVar107._8_4_ | (uint)!bVar19 * auVar90._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar19 * auVar107._12_4_ | (uint)!bVar19 * auVar90._12_4_)
          ;
          fVar163 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar107._16_4_);
          auVar124._16_4_ = fVar163;
          fVar141 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar107._20_4_);
          auVar124._20_4_ = fVar141;
          fVar142 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar107._24_4_);
          auVar124._24_4_ = fVar142;
          iVar1 = (uint)(byte)(uVar72 >> 7) * auVar107._28_4_;
          auVar124._28_4_ = iVar1;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar105);
          auVar125._0_4_ =
               (uint)(bVar71 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar87._0_4_;
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar19 * auVar99._4_4_ | (uint)!bVar19 * auVar87._4_4_;
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar19 * auVar99._8_4_ | (uint)!bVar19 * auVar87._8_4_;
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar19 * auVar99._12_4_ | (uint)!bVar19 * auVar87._12_4_;
          auVar125._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar99._16_4_;
          auVar125._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar99._20_4_;
          auVar125._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar99._24_4_;
          auVar125._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar11),ZEXT1632(auVar86));
          auVar126._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar7._0_4_
                      );
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar19 * auVar99._4_4_ | (uint)!bVar19 * auVar7._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar19 * auVar99._8_4_ | (uint)!bVar19 * auVar7._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar19 * auVar99._12_4_ | (uint)!bVar19 * auVar7._12_4_);
          fVar157 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar99._16_4_);
          auVar126._16_4_ = fVar157;
          fVar162 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar99._20_4_);
          auVar126._20_4_ = fVar162;
          fVar172 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar99._24_4_);
          auVar126._24_4_ = fVar172;
          auVar126._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar159),ZEXT1632(auVar85));
          auVar127._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar8._0_4_
                      );
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar19 * auVar99._4_4_ | (uint)!bVar19 * auVar8._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar19 * auVar99._8_4_ | (uint)!bVar19 * auVar8._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar19 * auVar99._12_4_ | (uint)!bVar19 * auVar8._12_4_);
          fVar133 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar99._16_4_);
          auVar127._16_4_ = fVar133;
          fVar83 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar99._20_4_);
          auVar127._20_4_ = fVar83;
          fVar84 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar99._24_4_);
          auVar127._24_4_ = fVar84;
          iVar2 = (uint)(byte)(uVar72 >> 7) * auVar99._28_4_;
          auVar127._28_4_ = iVar2;
          auVar128._0_4_ =
               (uint)(bVar71 & 1) * (int)auVar10._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar105._0_4_;
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar19 * (int)auVar10._4_4_ | (uint)!bVar19 * auVar105._4_4_;
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar19 * (int)auVar10._8_4_ | (uint)!bVar19 * auVar105._8_4_;
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar19 * (int)auVar10._12_4_ | (uint)!bVar19 * auVar105._12_4_;
          auVar128._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar105._16_4_;
          auVar128._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar105._20_4_;
          auVar128._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar105._24_4_;
          auVar128._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar105._28_4_;
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar23 = (bool)((byte)(uVar72 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar22 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar24 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar105 = vsubps_avx512vl(auVar128,auVar102);
          auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar11._12_4_ |
                                                  (uint)!bVar23 * auVar86._12_4_,
                                                  CONCAT48((uint)bVar21 * (int)auVar11._8_4_ |
                                                           (uint)!bVar21 * auVar86._8_4_,
                                                           CONCAT44((uint)bVar19 *
                                                                    (int)auVar11._4_4_ |
                                                                    (uint)!bVar19 * auVar86._4_4_,
                                                                    (uint)(bVar71 & 1) *
                                                                    (int)auVar11._0_4_ |
                                                                    (uint)!(bool)(bVar71 & 1) *
                                                                    auVar86._0_4_)))),auVar103);
          auVar192 = ZEXT3264(auVar98);
          auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar24 * (int)auVar159._12_4_ |
                                                   (uint)!bVar24 * auVar85._12_4_,
                                                   CONCAT48((uint)bVar22 * (int)auVar159._8_4_ |
                                                            (uint)!bVar22 * auVar85._8_4_,
                                                            CONCAT44((uint)bVar20 *
                                                                     (int)auVar159._4_4_ |
                                                                     (uint)!bVar20 * auVar85._4_4_,
                                                                     (uint)(bVar71 & 1) *
                                                                     (int)auVar159._0_4_ |
                                                                     (uint)!(bool)(bVar71 & 1) *
                                                                     auVar85._0_4_)))),auVar124);
          auVar106 = vsubps_avx(auVar102,auVar125);
          auVar196 = ZEXT3264(auVar106);
          auVar100 = vsubps_avx(auVar103,auVar126);
          auVar101 = vsubps_avx(auVar124,auVar127);
          auVar60._4_4_ = auVar107._4_4_ * fVar135;
          auVar60._0_4_ = auVar107._0_4_ * fVar173;
          auVar60._8_4_ = auVar107._8_4_ * fVar138;
          auVar60._12_4_ = auVar107._12_4_ * fVar139;
          auVar60._16_4_ = auVar107._16_4_ * 0.0;
          auVar60._20_4_ = auVar107._20_4_ * 0.0;
          auVar60._24_4_ = auVar107._24_4_ * 0.0;
          auVar60._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar60,auVar124,auVar105);
          auVar180._0_4_ = fVar134 * auVar105._0_4_;
          auVar180._4_4_ = fVar137 * auVar105._4_4_;
          auVar180._8_4_ = fVar136 * auVar105._8_4_;
          auVar180._12_4_ = fVar140 * auVar105._12_4_;
          auVar180._16_4_ = auVar105._16_4_ * 0.0;
          auVar180._20_4_ = auVar105._20_4_ * 0.0;
          auVar180._24_4_ = auVar105._24_4_ * 0.0;
          auVar180._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar180,auVar102,auVar98);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar93,ZEXT1632(auVar86));
          auVar184._0_4_ = auVar98._0_4_ * auVar124._0_4_;
          auVar184._4_4_ = auVar98._4_4_ * auVar124._4_4_;
          auVar184._8_4_ = auVar98._8_4_ * auVar124._8_4_;
          auVar184._12_4_ = auVar98._12_4_ * auVar124._12_4_;
          auVar184._16_4_ = auVar98._16_4_ * fVar163;
          auVar184._20_4_ = auVar98._20_4_ * fVar141;
          auVar184._24_4_ = auVar98._24_4_ * fVar142;
          auVar184._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar184,auVar103,auVar107);
          auVar96 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar86));
          auVar99 = vmulps_avx512vl(auVar101,auVar125);
          auVar99 = vfmsub231ps_avx512vl(auVar99,auVar106,auVar127);
          auVar61._4_4_ = auVar100._4_4_ * auVar127._4_4_;
          auVar61._0_4_ = auVar100._0_4_ * auVar127._0_4_;
          auVar61._8_4_ = auVar100._8_4_ * auVar127._8_4_;
          auVar61._12_4_ = auVar100._12_4_ * auVar127._12_4_;
          auVar61._16_4_ = auVar100._16_4_ * fVar133;
          auVar61._20_4_ = auVar100._20_4_ * fVar83;
          auVar61._24_4_ = auVar100._24_4_ * fVar84;
          auVar61._28_4_ = iVar2;
          auVar86 = vfmsub231ps_fma(auVar61,auVar126,auVar101);
          auVar185._0_4_ = auVar126._0_4_ * auVar106._0_4_;
          auVar185._4_4_ = auVar126._4_4_ * auVar106._4_4_;
          auVar185._8_4_ = auVar126._8_4_ * auVar106._8_4_;
          auVar185._12_4_ = auVar126._12_4_ * auVar106._12_4_;
          auVar185._16_4_ = fVar157 * auVar106._16_4_;
          auVar185._20_4_ = fVar162 * auVar106._20_4_;
          auVar185._24_4_ = fVar172 * auVar106._24_4_;
          auVar185._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar185,auVar100,auVar125);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar93,auVar99);
          auVar92 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar86));
          auVar186 = ZEXT3264(auVar92);
          auVar99 = vmaxps_avx(auVar96,auVar92);
          uVar158 = vcmpps_avx512vl(auVar99,auVar93,2);
          bVar80 = bVar80 & (byte)uVar158;
          if (bVar80 != 0) {
            uVar143 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar212._4_4_ = uVar143;
            auVar212._0_4_ = uVar143;
            auVar212._8_4_ = uVar143;
            auVar212._12_4_ = uVar143;
            auVar212._16_4_ = uVar143;
            auVar212._20_4_ = uVar143;
            auVar212._24_4_ = uVar143;
            auVar212._28_4_ = uVar143;
            auVar213 = ZEXT3264(auVar212);
            auVar62._4_4_ = auVar101._4_4_ * auVar98._4_4_;
            auVar62._0_4_ = auVar101._0_4_ * auVar98._0_4_;
            auVar62._8_4_ = auVar101._8_4_ * auVar98._8_4_;
            auVar62._12_4_ = auVar101._12_4_ * auVar98._12_4_;
            auVar62._16_4_ = auVar101._16_4_ * auVar98._16_4_;
            auVar62._20_4_ = auVar101._20_4_ * auVar98._20_4_;
            auVar62._24_4_ = auVar101._24_4_ * auVar98._24_4_;
            auVar62._28_4_ = auVar99._28_4_;
            auVar6 = vfmsub231ps_fma(auVar62,auVar100,auVar107);
            auVar63._4_4_ = auVar107._4_4_ * auVar106._4_4_;
            auVar63._0_4_ = auVar107._0_4_ * auVar106._0_4_;
            auVar63._8_4_ = auVar107._8_4_ * auVar106._8_4_;
            auVar63._12_4_ = auVar107._12_4_ * auVar106._12_4_;
            auVar63._16_4_ = auVar107._16_4_ * auVar106._16_4_;
            auVar63._20_4_ = auVar107._20_4_ * auVar106._20_4_;
            auVar63._24_4_ = auVar107._24_4_ * auVar106._24_4_;
            auVar63._28_4_ = auVar107._28_4_;
            auVar87 = vfmsub231ps_fma(auVar63,auVar105,auVar101);
            auVar64._4_4_ = auVar100._4_4_ * auVar105._4_4_;
            auVar64._0_4_ = auVar100._0_4_ * auVar105._0_4_;
            auVar64._8_4_ = auVar100._8_4_ * auVar105._8_4_;
            auVar64._12_4_ = auVar100._12_4_ * auVar105._12_4_;
            auVar64._16_4_ = auVar100._16_4_ * auVar105._16_4_;
            auVar64._20_4_ = auVar100._20_4_ * auVar105._20_4_;
            auVar64._24_4_ = auVar100._24_4_ * auVar105._24_4_;
            auVar64._28_4_ = auVar100._28_4_;
            auVar7 = vfmsub231ps_fma(auVar64,auVar106,auVar98);
            auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar87),ZEXT1632(auVar7));
            auVar85 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT1632(auVar6),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar99 = vrcp14ps_avx512vl(ZEXT1632(auVar85));
            auVar31._8_4_ = 0x3f800000;
            auVar31._0_8_ = 0x3f8000003f800000;
            auVar31._12_4_ = 0x3f800000;
            auVar31._16_4_ = 0x3f800000;
            auVar31._20_4_ = 0x3f800000;
            auVar31._24_4_ = 0x3f800000;
            auVar31._28_4_ = 0x3f800000;
            auVar98 = vfnmadd213ps_avx512vl(auVar99,ZEXT1632(auVar85),auVar31);
            auVar86 = vfmadd132ps_fma(auVar98,auVar99,auVar99);
            auVar192 = ZEXT1664(auVar86);
            auVar65._4_4_ = auVar7._4_4_ * auVar124._4_4_;
            auVar65._0_4_ = auVar7._0_4_ * auVar124._0_4_;
            auVar65._8_4_ = auVar7._8_4_ * auVar124._8_4_;
            auVar65._12_4_ = auVar7._12_4_ * auVar124._12_4_;
            auVar65._16_4_ = fVar163 * 0.0;
            auVar65._20_4_ = fVar141 * 0.0;
            auVar65._24_4_ = fVar142 * 0.0;
            auVar65._28_4_ = iVar1;
            auVar87 = vfmadd231ps_fma(auVar65,auVar103,ZEXT1632(auVar87));
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar102,ZEXT1632(auVar6));
            fVar163 = auVar86._0_4_;
            fVar141 = auVar86._4_4_;
            fVar142 = auVar86._8_4_;
            fVar157 = auVar86._12_4_;
            local_520._28_4_ = auVar99._28_4_;
            local_520._0_28_ =
                 ZEXT1628(CONCAT412(auVar87._12_4_ * fVar157,
                                    CONCAT48(auVar87._8_4_ * fVar142,
                                             CONCAT44(auVar87._4_4_ * fVar141,
                                                      auVar87._0_4_ * fVar163))));
            auVar196 = ZEXT3264(local_520);
            uVar158 = vcmpps_avx512vl(local_520,auVar212,2);
            auVar68._4_4_ = uStack_49c;
            auVar68._0_4_ = local_4a0;
            auVar68._8_4_ = uStack_498;
            auVar68._12_4_ = uStack_494;
            auVar68._16_4_ = uStack_490;
            auVar68._20_4_ = uStack_48c;
            auVar68._24_4_ = uStack_488;
            auVar68._28_4_ = uStack_484;
            uVar25 = vcmpps_avx512vl(local_520,auVar68,0xd);
            bVar80 = (byte)uVar158 & (byte)uVar25 & bVar80;
            if (bVar80 != 0) {
              uVar81 = vcmpps_avx512vl(ZEXT1632(auVar85),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar81 = bVar80 & uVar81;
              if ((char)uVar81 != '\0') {
                fVar162 = auVar96._0_4_ * fVar163;
                fVar172 = auVar96._4_4_ * fVar141;
                auVar66._4_4_ = fVar172;
                auVar66._0_4_ = fVar162;
                fVar83 = auVar96._8_4_ * fVar142;
                auVar66._8_4_ = fVar83;
                fVar84 = auVar96._12_4_ * fVar157;
                auVar66._12_4_ = fVar84;
                fVar133 = auVar96._16_4_ * 0.0;
                auVar66._16_4_ = fVar133;
                fVar173 = auVar96._20_4_ * 0.0;
                auVar66._20_4_ = fVar173;
                fVar134 = auVar96._24_4_ * 0.0;
                auVar66._24_4_ = fVar134;
                auVar66._28_4_ = auVar96._28_4_;
                auVar171._8_4_ = 0x3f800000;
                auVar171._0_8_ = 0x3f8000003f800000;
                auVar171._12_4_ = 0x3f800000;
                auVar171._16_4_ = 0x3f800000;
                auVar171._20_4_ = 0x3f800000;
                auVar171._24_4_ = 0x3f800000;
                auVar171._28_4_ = 0x3f800000;
                auVar99 = vsubps_avx(auVar171,auVar66);
                local_2c0._0_4_ =
                     (float)((uint)(bVar71 & 1) * (int)fVar162 |
                            (uint)!(bool)(bVar71 & 1) * auVar99._0_4_);
                bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar19 * (int)fVar172 | (uint)!bVar19 * auVar99._4_4_);
                bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar19 * (int)fVar83 | (uint)!bVar19 * auVar99._8_4_);
                bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar19 * (int)fVar84 | (uint)!bVar19 * auVar99._12_4_);
                bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar19 * (int)fVar133 | (uint)!bVar19 * auVar99._16_4_);
                bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar19 * (int)fVar173 | (uint)!bVar19 * auVar99._20_4_);
                bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar19 * (int)fVar134 | (uint)!bVar19 * auVar99._24_4_);
                bVar19 = SUB81(uVar72 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar19 * auVar96._28_4_ | (uint)!bVar19 * auVar99._28_4_);
                auVar99 = vsubps_avx(auVar104,auVar97);
                auVar86 = vfmadd213ps_fma(auVar99,local_2c0,auVar97);
                uVar143 = *(undefined4 *)((long)local_5d8->ray_space + k * 4 + -0x10);
                auVar32._4_4_ = uVar143;
                auVar32._0_4_ = uVar143;
                auVar32._8_4_ = uVar143;
                auVar32._12_4_ = uVar143;
                auVar32._16_4_ = uVar143;
                auVar32._20_4_ = uVar143;
                auVar32._24_4_ = uVar143;
                auVar32._28_4_ = uVar143;
                auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                             CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                                      CONCAT44(auVar86._4_4_ +
                                                                               auVar86._4_4_,
                                                                               auVar86._0_4_ +
                                                                               auVar86._0_4_)))),
                                          auVar32);
                uVar82 = vcmpps_avx512vl(local_520,auVar99,6);
                uVar81 = uVar81 & uVar82;
                bVar80 = (byte)uVar81;
                if (bVar80 != 0) {
                  auVar161._0_4_ = auVar92._0_4_ * fVar163;
                  auVar161._4_4_ = auVar92._4_4_ * fVar141;
                  auVar161._8_4_ = auVar92._8_4_ * fVar142;
                  auVar161._12_4_ = auVar92._12_4_ * fVar157;
                  auVar161._16_4_ = auVar92._16_4_ * 0.0;
                  auVar161._20_4_ = auVar92._20_4_ * 0.0;
                  auVar161._24_4_ = auVar92._24_4_ * 0.0;
                  auVar161._28_4_ = 0;
                  auVar181._8_4_ = 0x3f800000;
                  auVar181._0_8_ = 0x3f8000003f800000;
                  auVar181._12_4_ = 0x3f800000;
                  auVar181._16_4_ = 0x3f800000;
                  auVar181._20_4_ = 0x3f800000;
                  auVar181._24_4_ = 0x3f800000;
                  auVar181._28_4_ = 0x3f800000;
                  auVar99 = vsubps_avx(auVar181,auVar161);
                  auVar129._0_4_ =
                       (uint)(bVar71 & 1) * (int)auVar161._0_4_ |
                       (uint)!(bool)(bVar71 & 1) * auVar99._0_4_;
                  bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
                  auVar129._4_4_ =
                       (uint)bVar19 * (int)auVar161._4_4_ | (uint)!bVar19 * auVar99._4_4_;
                  bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
                  auVar129._8_4_ =
                       (uint)bVar19 * (int)auVar161._8_4_ | (uint)!bVar19 * auVar99._8_4_;
                  bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
                  auVar129._12_4_ =
                       (uint)bVar19 * (int)auVar161._12_4_ | (uint)!bVar19 * auVar99._12_4_;
                  bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
                  auVar129._16_4_ =
                       (uint)bVar19 * (int)auVar161._16_4_ | (uint)!bVar19 * auVar99._16_4_;
                  bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
                  auVar129._20_4_ =
                       (uint)bVar19 * (int)auVar161._20_4_ | (uint)!bVar19 * auVar99._20_4_;
                  bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
                  auVar129._24_4_ =
                       (uint)bVar19 * (int)auVar161._24_4_ | (uint)!bVar19 * auVar99._24_4_;
                  auVar129._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar99._28_4_;
                  auVar33._8_4_ = 0x40000000;
                  auVar33._0_8_ = 0x4000000040000000;
                  auVar33._12_4_ = 0x40000000;
                  auVar33._16_4_ = 0x40000000;
                  auVar33._20_4_ = 0x40000000;
                  auVar33._24_4_ = 0x40000000;
                  auVar33._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar129,auVar181,auVar33);
                  local_280 = local_520;
                  local_260 = (int)lVar75;
                  local_25c = iVar14;
                  local_250 = local_5a0._0_8_;
                  uStack_248 = local_5a0._8_8_;
                  local_240 = local_5b0._0_8_;
                  uStack_238 = local_5b0._8_8_;
                  local_230 = local_5c0._0_8_;
                  uStack_228 = local_5c0._8_8_;
                  local_220 = local_5d0;
                  uStack_218 = uStack_5c8;
                  pGVar77 = (context->scene->geometries).items[uVar78].ptr;
                  if ((pGVar77->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar86 = vcvtsi2ss_avx512f(auVar91,(int)lVar75);
                    fVar163 = auVar86._0_4_;
                    local_200[0] = (fVar163 + local_2c0._0_4_ + 0.0) * local_120;
                    local_200[1] = (fVar163 + local_2c0._4_4_ + 1.0) * fStack_11c;
                    local_200[2] = (fVar163 + local_2c0._8_4_ + 2.0) * fStack_118;
                    local_200[3] = (fVar163 + local_2c0._12_4_ + 3.0) * fStack_114;
                    fStack_1f0 = (fVar163 + local_2c0._16_4_ + 4.0) * fStack_110;
                    fStack_1ec = (fVar163 + local_2c0._20_4_ + 5.0) * fStack_10c;
                    fStack_1e8 = (fVar163 + local_2c0._24_4_ + 6.0) * fStack_108;
                    fStack_1e4 = fVar163 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_520;
                    auVar152._8_4_ = 0x7f800000;
                    auVar152._0_8_ = 0x7f8000007f800000;
                    auVar152._12_4_ = 0x7f800000;
                    auVar152._16_4_ = 0x7f800000;
                    auVar152._20_4_ = 0x7f800000;
                    auVar152._24_4_ = 0x7f800000;
                    auVar152._28_4_ = 0x7f800000;
                    auVar99 = vblendmps_avx512vl(auVar152,local_520);
                    auVar130._0_4_ =
                         (uint)(bVar80 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000
                    ;
                    bVar19 = (bool)((byte)(uVar81 >> 1) & 1);
                    auVar130._4_4_ = (uint)bVar19 * auVar99._4_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar81 >> 2) & 1);
                    auVar130._8_4_ = (uint)bVar19 * auVar99._8_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar81 >> 3) & 1);
                    auVar130._12_4_ = (uint)bVar19 * auVar99._12_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar81 >> 4) & 1);
                    auVar130._16_4_ = (uint)bVar19 * auVar99._16_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar81 >> 5) & 1);
                    auVar130._20_4_ = (uint)bVar19 * auVar99._20_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)((byte)(uVar81 >> 6) & 1);
                    auVar130._24_4_ = (uint)bVar19 * auVar99._24_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = SUB81(uVar81 >> 7,0);
                    auVar130._28_4_ = (uint)bVar19 * auVar99._28_4_ | (uint)!bVar19 * 0x7f800000;
                    auVar99 = vshufps_avx(auVar130,auVar130,0xb1);
                    auVar99 = vminps_avx(auVar130,auVar99);
                    auVar98 = vshufpd_avx(auVar99,auVar99,5);
                    auVar99 = vminps_avx(auVar99,auVar98);
                    auVar98 = vpermpd_avx2(auVar99,0x4e);
                    auVar99 = vminps_avx(auVar99,auVar98);
                    uVar158 = vcmpps_avx512vl(auVar130,auVar99,0);
                    uVar73 = (uint)uVar81;
                    if (((byte)uVar158 & bVar80) != 0) {
                      uVar73 = (uint)((byte)uVar158 & bVar80);
                    }
                    uVar74 = 0;
                    for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                      uVar74 = uVar74 + 1;
                    }
                    uVar72 = (ulong)uVar74;
                    pGVar70 = pGVar77;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      do {
                        local_558 = pGVar70;
                        local_440 = local_200[uVar72];
                        local_430 = *(undefined4 *)(local_1e0 + uVar72 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1c0 + uVar72 * 4);
                        local_588.context = context->user;
                        fVar141 = 1.0 - local_440;
                        fVar163 = fVar141 * fVar141 * -3.0;
                        auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141)),
                                                  ZEXT416((uint)(local_440 * fVar141)),
                                                  ZEXT416(0xc0000000));
                        auVar85 = vfmsub132ss_fma(ZEXT416((uint)(local_440 * fVar141)),
                                                  ZEXT416((uint)(local_440 * local_440)),
                                                  ZEXT416(0x40000000));
                        fVar141 = auVar86._0_4_ * 3.0;
                        fVar142 = auVar85._0_4_ * 3.0;
                        fVar157 = local_440 * local_440 * 3.0;
                        auVar189._0_4_ = fVar157 * (float)local_5d0._0_4_;
                        auVar189._4_4_ = fVar157 * (float)local_5d0._4_4_;
                        auVar189._8_4_ = fVar157 * (float)uStack_5c8;
                        auVar189._12_4_ = fVar157 * uStack_5c8._4_4_;
                        auVar192 = ZEXT1664(auVar189);
                        auVar144._4_4_ = fVar142;
                        auVar144._0_4_ = fVar142;
                        auVar144._8_4_ = fVar142;
                        auVar144._12_4_ = fVar142;
                        auVar86 = vfmadd132ps_fma(auVar144,auVar189,local_5c0);
                        auVar177._4_4_ = fVar141;
                        auVar177._0_4_ = fVar141;
                        auVar177._8_4_ = fVar141;
                        auVar177._12_4_ = fVar141;
                        auVar86 = vfmadd132ps_fma(auVar177,auVar86,local_5b0);
                        auVar145._4_4_ = fVar163;
                        auVar145._0_4_ = fVar163;
                        auVar145._8_4_ = fVar163;
                        auVar145._12_4_ = fVar163;
                        auVar86 = vfmadd132ps_fma(auVar145,auVar86,local_5a0);
                        local_470 = auVar86._0_4_;
                        local_460 = vshufps_avx(auVar86,auVar86,0x55);
                        auVar186 = ZEXT1664(local_460);
                        local_450 = vshufps_avx(auVar86,auVar86,0xaa);
                        iStack_46c = local_470;
                        iStack_468 = local_470;
                        iStack_464 = local_470;
                        fStack_43c = local_440;
                        fStack_438 = local_440;
                        fStack_434 = local_440;
                        uStack_42c = local_430;
                        uStack_428 = local_430;
                        uStack_424 = local_430;
                        local_420 = local_540._0_8_;
                        uStack_418 = local_540._8_8_;
                        local_410 = local_550;
                        vpcmpeqd_avx2(ZEXT1632(local_550),ZEXT1632(local_550));
                        uStack_3fc = (local_588.context)->instID[0];
                        local_400 = uStack_3fc;
                        uStack_3f8 = uStack_3fc;
                        uStack_3f4 = uStack_3fc;
                        uStack_3f0 = (local_588.context)->instPrimID[0];
                        uStack_3ec = uStack_3f0;
                        uStack_3e8 = uStack_3f0;
                        uStack_3e4 = uStack_3f0;
                        local_5f0 = local_4d0;
                        local_588.valid = (int *)local_5f0;
                        local_588.geometryUserPtr = pGVar77->userPtr;
                        local_588.hit = (RTCHitN *)&local_470;
                        local_588.N = 4;
                        local_500 = auVar213._0_32_;
                        local_588.ray = (RTCRayN *)ray;
                        if (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar186 = ZEXT1664(local_460);
                          auVar192 = ZEXT1664(auVar189);
                          (*pGVar77->intersectionFilterN)(&local_588);
                          auVar196 = ZEXT3264(local_520);
                          auVar213 = ZEXT3264(local_500);
                          pGVar77 = local_558;
                        }
                        uVar82 = vptestmd_avx512vl(local_5f0,local_5f0);
                        if ((uVar82 & 0xf) == 0) {
LAB_01dd5fd6:
                          *(int *)(ray + k * 4 + 0x80) = auVar213._0_4_;
                        }
                        else {
                          p_Var18 = context->args->filter;
                          if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar77->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar186 = ZEXT1664(auVar186._0_16_);
                            auVar192 = ZEXT1664(auVar192._0_16_);
                            (*p_Var18)(&local_588);
                            auVar196 = ZEXT3264(local_520);
                            auVar213 = ZEXT3264(local_500);
                            pGVar77 = local_558;
                          }
                          uVar82 = vptestmd_avx512vl(local_5f0,local_5f0);
                          uVar82 = uVar82 & 0xf;
                          bVar80 = (byte)uVar82;
                          if (bVar80 == 0) goto LAB_01dd5fd6;
                          iVar1 = *(int *)(local_588.hit + 4);
                          iVar2 = *(int *)(local_588.hit + 8);
                          iVar67 = *(int *)(local_588.hit + 0xc);
                          bVar19 = (bool)((byte)(uVar82 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar82 >> 2) & 1);
                          bVar21 = SUB81(uVar82 >> 3,0);
                          *(uint *)(local_588.ray + 0xc0) =
                               (uint)(bVar80 & 1) * *(int *)local_588.hit |
                               (uint)!(bool)(bVar80 & 1) * *(int *)(local_588.ray + 0xc0);
                          *(uint *)(local_588.ray + 0xc4) =
                               (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_588.ray + 0xc4)
                          ;
                          *(uint *)(local_588.ray + 200) =
                               (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_588.ray + 200);
                          *(uint *)(local_588.ray + 0xcc) =
                               (uint)bVar21 * iVar67 |
                               (uint)!bVar21 * *(int *)(local_588.ray + 0xcc);
                          iVar1 = *(int *)(local_588.hit + 0x14);
                          iVar2 = *(int *)(local_588.hit + 0x18);
                          iVar67 = *(int *)(local_588.hit + 0x1c);
                          bVar19 = (bool)((byte)(uVar82 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar82 >> 2) & 1);
                          bVar21 = SUB81(uVar82 >> 3,0);
                          *(uint *)(local_588.ray + 0xd0) =
                               (uint)(bVar80 & 1) * *(int *)(local_588.hit + 0x10) |
                               (uint)!(bool)(bVar80 & 1) * *(int *)(local_588.ray + 0xd0);
                          *(uint *)(local_588.ray + 0xd4) =
                               (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_588.ray + 0xd4)
                          ;
                          *(uint *)(local_588.ray + 0xd8) =
                               (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_588.ray + 0xd8)
                          ;
                          *(uint *)(local_588.ray + 0xdc) =
                               (uint)bVar21 * iVar67 |
                               (uint)!bVar21 * *(int *)(local_588.ray + 0xdc);
                          iVar1 = *(int *)(local_588.hit + 0x24);
                          iVar2 = *(int *)(local_588.hit + 0x28);
                          iVar67 = *(int *)(local_588.hit + 0x2c);
                          bVar19 = (bool)((byte)(uVar82 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar82 >> 2) & 1);
                          bVar21 = SUB81(uVar82 >> 3,0);
                          *(uint *)(local_588.ray + 0xe0) =
                               (uint)(bVar80 & 1) * *(int *)(local_588.hit + 0x20) |
                               (uint)!(bool)(bVar80 & 1) * *(int *)(local_588.ray + 0xe0);
                          *(uint *)(local_588.ray + 0xe4) =
                               (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_588.ray + 0xe4)
                          ;
                          *(uint *)(local_588.ray + 0xe8) =
                               (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_588.ray + 0xe8)
                          ;
                          *(uint *)(local_588.ray + 0xec) =
                               (uint)bVar21 * iVar67 |
                               (uint)!bVar21 * *(int *)(local_588.ray + 0xec);
                          iVar1 = *(int *)(local_588.hit + 0x34);
                          iVar2 = *(int *)(local_588.hit + 0x38);
                          iVar67 = *(int *)(local_588.hit + 0x3c);
                          bVar19 = (bool)((byte)(uVar82 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar82 >> 2) & 1);
                          bVar21 = SUB81(uVar82 >> 3,0);
                          *(uint *)(local_588.ray + 0xf0) =
                               (uint)(bVar80 & 1) * *(int *)(local_588.hit + 0x30) |
                               (uint)!(bool)(bVar80 & 1) * *(int *)(local_588.ray + 0xf0);
                          *(uint *)(local_588.ray + 0xf4) =
                               (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_588.ray + 0xf4)
                          ;
                          *(uint *)(local_588.ray + 0xf8) =
                               (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_588.ray + 0xf8)
                          ;
                          *(uint *)(local_588.ray + 0xfc) =
                               (uint)bVar21 * iVar67 |
                               (uint)!bVar21 * *(int *)(local_588.ray + 0xfc);
                          iVar1 = *(int *)(local_588.hit + 0x44);
                          iVar2 = *(int *)(local_588.hit + 0x48);
                          iVar67 = *(int *)(local_588.hit + 0x4c);
                          bVar19 = (bool)((byte)(uVar82 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar82 >> 2) & 1);
                          bVar21 = SUB81(uVar82 >> 3,0);
                          *(uint *)(local_588.ray + 0x100) =
                               (uint)(bVar80 & 1) * *(int *)(local_588.hit + 0x40) |
                               (uint)!(bool)(bVar80 & 1) * *(int *)(local_588.ray + 0x100);
                          *(uint *)(local_588.ray + 0x104) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_588.ray + 0x104);
                          *(uint *)(local_588.ray + 0x108) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_588.ray + 0x108);
                          *(uint *)(local_588.ray + 0x10c) =
                               (uint)bVar21 * iVar67 |
                               (uint)!bVar21 * *(int *)(local_588.ray + 0x10c);
                          auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_588.ray + 0x110) = auVar86;
                          auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_588.ray + 0x120) = auVar86;
                          auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_588.ray + 0x130) = auVar86;
                          auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_588.ray + 0x140) = auVar86;
                          auVar213 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                        }
                        bVar80 = ~(byte)(1 << ((uint)uVar72 & 0x1f)) & (byte)uVar81;
                        uVar143 = auVar213._0_4_;
                        auVar153._4_4_ = uVar143;
                        auVar153._0_4_ = uVar143;
                        auVar153._8_4_ = uVar143;
                        auVar153._12_4_ = uVar143;
                        auVar153._16_4_ = uVar143;
                        auVar153._20_4_ = uVar143;
                        auVar153._24_4_ = uVar143;
                        auVar153._28_4_ = uVar143;
                        uVar158 = vcmpps_avx512vl(auVar196._0_32_,auVar153,2);
                        if ((bVar80 & (byte)uVar158) == 0) goto LAB_01dd6065;
                        bVar80 = bVar80 & (byte)uVar158;
                        uVar81 = (ulong)bVar80;
                        auVar154._8_4_ = 0x7f800000;
                        auVar154._0_8_ = 0x7f8000007f800000;
                        auVar154._12_4_ = 0x7f800000;
                        auVar154._16_4_ = 0x7f800000;
                        auVar154._20_4_ = 0x7f800000;
                        auVar154._24_4_ = 0x7f800000;
                        auVar154._28_4_ = 0x7f800000;
                        auVar99 = vblendmps_avx512vl(auVar154,auVar196._0_32_);
                        auVar131._0_4_ =
                             (uint)(bVar80 & 1) * auVar99._0_4_ |
                             (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                        bVar19 = (bool)(bVar80 >> 1 & 1);
                        auVar131._4_4_ = (uint)bVar19 * auVar99._4_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar80 >> 2 & 1);
                        auVar131._8_4_ = (uint)bVar19 * auVar99._8_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar80 >> 3 & 1);
                        auVar131._12_4_ = (uint)bVar19 * auVar99._12_4_ | (uint)!bVar19 * 0x7f800000
                        ;
                        bVar19 = (bool)(bVar80 >> 4 & 1);
                        auVar131._16_4_ = (uint)bVar19 * auVar99._16_4_ | (uint)!bVar19 * 0x7f800000
                        ;
                        bVar19 = (bool)(bVar80 >> 5 & 1);
                        auVar131._20_4_ = (uint)bVar19 * auVar99._20_4_ | (uint)!bVar19 * 0x7f800000
                        ;
                        bVar19 = (bool)(bVar80 >> 6 & 1);
                        auVar131._24_4_ = (uint)bVar19 * auVar99._24_4_ | (uint)!bVar19 * 0x7f800000
                        ;
                        auVar131._28_4_ =
                             (uint)(bVar80 >> 7) * auVar99._28_4_ |
                             (uint)!(bool)(bVar80 >> 7) * 0x7f800000;
                        auVar99 = vshufps_avx(auVar131,auVar131,0xb1);
                        auVar99 = vminps_avx(auVar131,auVar99);
                        auVar98 = vshufpd_avx(auVar99,auVar99,5);
                        auVar99 = vminps_avx(auVar99,auVar98);
                        auVar98 = vpermpd_avx2(auVar99,0x4e);
                        auVar99 = vminps_avx(auVar99,auVar98);
                        uVar158 = vcmpps_avx512vl(auVar131,auVar99,0);
                        bVar71 = (byte)uVar158 & bVar80;
                        if (bVar71 != 0) {
                          bVar80 = bVar71;
                        }
                        uVar73 = 0;
                        for (uVar74 = (uint)bVar80; (uVar74 & 1) == 0;
                            uVar74 = uVar74 >> 1 | 0x80000000) {
                          uVar73 = uVar73 + 1;
                        }
                        uVar72 = (ulong)uVar73;
                        pGVar70 = local_558;
                      } while( true );
                    }
                    fVar163 = local_200[uVar72];
                    uVar143 = *(undefined4 *)(local_1e0 + uVar72 * 4);
                    fVar142 = 1.0 - fVar163;
                    fVar141 = fVar142 * fVar142 * -3.0;
                    auVar186 = ZEXT464((uint)fVar141);
                    auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),
                                              ZEXT416((uint)(fVar163 * fVar142)),ZEXT416(0xc0000000)
                                             );
                    auVar85 = vfmsub132ss_fma(ZEXT416((uint)(fVar163 * fVar142)),
                                              ZEXT416((uint)(fVar163 * fVar163)),ZEXT416(0x40000000)
                                             );
                    fVar142 = auVar86._0_4_ * 3.0;
                    fVar157 = auVar85._0_4_ * 3.0;
                    fVar162 = fVar163 * fVar163 * 3.0;
                    auVar188._0_4_ = fVar162 * (float)local_5d0._0_4_;
                    auVar188._4_4_ = fVar162 * (float)local_5d0._4_4_;
                    auVar188._8_4_ = fVar162 * (float)uStack_5c8;
                    auVar188._12_4_ = fVar162 * uStack_5c8._4_4_;
                    auVar192 = ZEXT1664(auVar188);
                    auVar167._4_4_ = fVar157;
                    auVar167._0_4_ = fVar157;
                    auVar167._8_4_ = fVar157;
                    auVar167._12_4_ = fVar157;
                    auVar86 = vfmadd132ps_fma(auVar167,auVar188,local_5c0);
                    auVar176._4_4_ = fVar142;
                    auVar176._0_4_ = fVar142;
                    auVar176._8_4_ = fVar142;
                    auVar176._12_4_ = fVar142;
                    auVar86 = vfmadd132ps_fma(auVar176,auVar86,local_5b0);
                    auVar168._4_4_ = fVar141;
                    auVar168._0_4_ = fVar141;
                    auVar168._8_4_ = fVar141;
                    auVar168._12_4_ = fVar141;
                    auVar86 = vfmadd132ps_fma(auVar168,auVar86,local_5a0);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar72 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar86._0_4_;
                    uVar15 = vextractps_avx(auVar86,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar15;
                    uVar15 = vextractps_avx(auVar86,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar15;
                    *(float *)(ray + k * 4 + 0xf0) = fVar163;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar143;
                    *(uint *)(ray + k * 4 + 0x110) = uVar13;
                    *(uint *)(ray + k * 4 + 0x120) = uVar78;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01dd5cde;
      }
LAB_01dd5373:
      uVar143 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar30._4_4_ = uVar143;
      auVar30._0_4_ = uVar143;
      auVar30._8_4_ = uVar143;
      auVar30._12_4_ = uVar143;
      auVar30._16_4_ = uVar143;
      auVar30._20_4_ = uVar143;
      auVar30._24_4_ = uVar143;
      auVar30._28_4_ = uVar143;
      uVar158 = vcmpps_avx512vl(local_80,auVar30,2);
      uVar78 = (uint)uVar79 & (uint)uVar79 + 0xff & (uint)uVar158;
      uVar79 = (ulong)uVar78;
    } while (uVar78 != 0);
  }
  return;
LAB_01dd6065:
  auVar99 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar216 = ZEXT3264(auVar99);
  auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar214 = ZEXT3264(auVar99);
  auVar215 = ZEXT464(0xbf800000);
LAB_01dd5cde:
  lVar75 = lVar75 + 8;
  if (iVar14 <= (int)lVar75) goto LAB_01dd5373;
  goto LAB_01dd5427;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }